

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qownlanguagedata.cpp
# Opt level: O2

void initCMakeData(void)

{
  initializer_list<std::pair<char,_QLatin1String>_> list;
  initializer_list<std::pair<char,_QLatin1String>_> list_00;
  initializer_list<std::pair<char,_QLatin1String>_> list_01;
  initializer_list<std::pair<char,_QLatin1String>_> list_02;
  QMultiHash<char,_QLatin1String> QStack_1398;
  pair<char,_QLatin1String> local_1388;
  undefined1 local_1370;
  undefined8 local_1368;
  char *local_1360;
  undefined1 local_1358;
  undefined8 local_1350;
  char *local_1348;
  undefined1 local_1340;
  undefined8 local_1338;
  char *local_1330;
  undefined1 local_1328;
  undefined8 local_1320;
  char *local_1318;
  undefined1 local_1310;
  undefined8 local_1308;
  char *local_1300;
  undefined1 local_12f8;
  undefined8 local_12f0;
  char *local_12e8;
  undefined1 local_12e0;
  undefined8 local_12d8;
  char *local_12d0;
  undefined1 local_12c8;
  undefined8 local_12c0;
  char *local_12b8;
  undefined1 local_12b0;
  undefined8 local_12a8;
  char *local_12a0;
  undefined1 local_1298;
  undefined8 local_1290;
  char *local_1288;
  undefined1 local_1280;
  undefined8 local_1278;
  char *local_1270;
  undefined1 local_1268;
  undefined8 local_1260;
  char *local_1258;
  undefined1 local_1250;
  undefined8 local_1248;
  char *local_1240;
  undefined1 local_1238;
  undefined8 local_1230;
  char *local_1228;
  undefined1 local_1220;
  undefined8 local_1218;
  char *local_1210;
  undefined1 local_1208;
  undefined8 local_1200;
  char *local_11f8;
  undefined1 local_11f0;
  undefined8 local_11e8;
  char *local_11e0;
  undefined1 local_11d8;
  undefined8 local_11d0;
  char *local_11c8;
  undefined1 local_11c0;
  undefined8 local_11b8;
  char *local_11b0;
  undefined1 local_11a8;
  undefined8 local_11a0;
  char *local_1198;
  undefined1 local_1190;
  undefined8 local_1188;
  char *local_1180;
  undefined1 local_1178;
  undefined8 local_1170;
  char *local_1168;
  undefined1 local_1160;
  undefined8 local_1158;
  char *local_1150;
  undefined1 local_1148;
  undefined8 local_1140;
  char *local_1138;
  undefined1 local_1130;
  undefined8 local_1128;
  char *local_1120;
  undefined1 local_1118;
  undefined8 local_1110;
  char *local_1108;
  undefined1 local_1100;
  undefined8 local_10f8;
  char *local_10f0;
  undefined1 local_10e8;
  undefined8 local_10e0;
  char *local_10d8;
  undefined1 local_10d0;
  undefined8 local_10c8;
  char *local_10c0;
  undefined1 local_10b8;
  undefined8 local_10b0;
  char *local_10a8;
  undefined1 local_10a0;
  undefined8 local_1098;
  char *local_1090;
  undefined1 local_1088;
  undefined8 local_1080;
  char *local_1078;
  undefined1 local_1070;
  undefined8 local_1068;
  char *local_1060;
  undefined1 local_1058;
  undefined8 local_1050;
  char *local_1048;
  undefined1 local_1040;
  undefined8 local_1038;
  char *local_1030;
  undefined1 local_1028;
  undefined8 local_1020;
  char *local_1018;
  undefined1 local_1010;
  undefined8 local_1008;
  char *local_1000;
  undefined1 local_ff8;
  undefined8 local_ff0;
  char *local_fe8;
  undefined1 local_fe0;
  undefined8 local_fd8;
  char *local_fd0;
  undefined1 local_fc8;
  undefined8 local_fc0;
  char *local_fb8;
  undefined1 local_fb0;
  undefined8 local_fa8;
  char *local_fa0;
  undefined1 local_f98;
  undefined8 local_f90;
  char *local_f88;
  undefined1 local_f80;
  undefined8 local_f78;
  char *local_f70;
  undefined1 local_f68;
  undefined8 local_f60;
  char *local_f58;
  undefined1 local_f50;
  undefined8 local_f48;
  char *local_f40;
  undefined1 local_f38;
  undefined8 local_f30;
  char *local_f28;
  undefined1 local_f20;
  undefined8 local_f18;
  char *local_f10;
  undefined1 local_f08;
  undefined8 local_f00;
  char *local_ef8;
  undefined1 local_ef0;
  undefined8 local_ee8;
  char *local_ee0;
  undefined1 local_ed8;
  undefined8 local_ed0;
  char *local_ec8;
  undefined1 local_ec0;
  undefined8 local_eb8;
  char *local_eb0;
  undefined1 local_ea8;
  undefined8 local_ea0;
  char *local_e98;
  undefined1 local_e90;
  undefined8 local_e88;
  char *local_e80;
  undefined1 local_e78;
  undefined8 local_e70;
  char *local_e68;
  undefined1 local_e60;
  undefined8 local_e58;
  char *local_e50;
  undefined1 local_e48;
  undefined8 local_e40;
  char *local_e38;
  undefined1 local_e30;
  undefined8 local_e28;
  char *local_e20;
  undefined1 local_e18;
  undefined8 local_e10;
  char *local_e08;
  undefined1 local_e00;
  undefined8 local_df8;
  char *local_df0;
  undefined1 local_de8;
  undefined8 local_de0;
  char *local_dd8;
  undefined1 local_dd0;
  undefined8 local_dc8;
  char *local_dc0;
  undefined1 local_db8;
  undefined8 local_db0;
  char *local_da8;
  undefined1 local_da0;
  undefined8 local_d98;
  char *local_d90;
  undefined1 local_d88;
  undefined8 local_d80;
  char *local_d78;
  undefined1 local_d70;
  undefined8 local_d68;
  char *local_d60;
  undefined1 local_d58;
  undefined8 local_d50;
  char *local_d48;
  undefined1 local_d40;
  undefined8 local_d38;
  char *local_d30;
  undefined1 local_d28;
  undefined8 local_d20;
  char *local_d18;
  undefined1 local_d10;
  undefined8 local_d08;
  char *local_d00;
  undefined1 local_cf8;
  undefined8 local_cf0;
  char *local_ce8;
  undefined1 local_ce0;
  undefined8 local_cd8;
  char *local_cd0;
  undefined1 local_cc8;
  undefined8 local_cc0;
  char *local_cb8;
  undefined1 local_cb0;
  undefined8 local_ca8;
  char *local_ca0;
  undefined1 local_c98;
  undefined8 local_c90;
  char *local_c88;
  undefined1 local_c80;
  undefined8 local_c78;
  char *local_c70;
  undefined1 local_c68;
  undefined8 local_c60;
  char *local_c58;
  undefined1 local_c50;
  undefined8 local_c48;
  char *local_c40;
  undefined1 local_c38;
  undefined8 local_c30;
  char *local_c28;
  undefined1 local_c20;
  undefined8 local_c18;
  char *local_c10;
  undefined1 local_c08;
  undefined8 local_c00;
  char *local_bf8;
  undefined1 local_bf0;
  undefined8 local_be8;
  char *local_be0;
  undefined1 local_bd8;
  undefined8 local_bd0;
  char *local_bc8;
  undefined1 local_bc0;
  undefined8 local_bb8;
  char *local_bb0;
  undefined1 local_ba8;
  undefined8 local_ba0;
  char *local_b98;
  undefined1 local_b90;
  undefined8 local_b88;
  char *local_b80;
  undefined1 local_b78;
  undefined8 local_b70;
  char *local_b68;
  undefined1 local_b60;
  undefined8 local_b58;
  char *local_b50;
  undefined1 local_b48;
  undefined8 local_b40;
  char *local_b38;
  undefined1 local_b30;
  undefined8 local_b28;
  char *local_b20;
  undefined1 local_b18;
  undefined8 local_b10;
  char *local_b08;
  undefined1 local_b00;
  undefined8 local_af8;
  char *local_af0;
  undefined1 local_ae8;
  undefined8 local_ae0;
  char *local_ad8;
  undefined1 local_ad0;
  undefined8 local_ac8;
  char *local_ac0;
  undefined1 local_ab8;
  undefined8 local_ab0;
  char *local_aa8;
  undefined1 local_aa0;
  undefined8 local_a98;
  char *local_a90;
  undefined1 local_a88;
  undefined8 local_a80;
  char *local_a78;
  undefined1 local_a70;
  undefined8 local_a68;
  char *local_a60;
  undefined1 local_a58;
  undefined8 local_a50;
  char *local_a48;
  undefined1 local_a40;
  undefined8 local_a38;
  char *local_a30;
  undefined1 local_a28;
  undefined8 local_a20;
  char *local_a18;
  undefined1 local_a10;
  undefined8 local_a08;
  char *local_a00;
  undefined1 local_9f8;
  undefined8 local_9f0;
  char *local_9e8;
  undefined1 local_9e0;
  undefined8 local_9d8;
  char *local_9d0;
  undefined1 local_9c8;
  undefined8 local_9c0;
  char *local_9b8;
  undefined1 local_9b0;
  undefined8 local_9a8;
  char *local_9a0;
  undefined1 local_998;
  undefined8 local_990;
  char *local_988;
  undefined1 local_980;
  undefined8 local_978;
  char *local_970;
  undefined1 local_968;
  undefined8 local_960;
  char *local_958;
  undefined1 local_950;
  undefined8 local_948;
  char *local_940;
  undefined1 local_938;
  undefined8 local_930;
  char *local_928;
  undefined1 local_920;
  undefined8 local_918;
  char *local_910;
  undefined1 local_908;
  undefined8 local_900;
  char *local_8f8;
  undefined1 local_8f0;
  undefined8 local_8e8;
  char *local_8e0;
  undefined1 local_8d8;
  undefined8 local_8d0;
  char *local_8c8;
  undefined1 local_8c0;
  undefined8 local_8b8;
  char *local_8b0;
  undefined1 local_8a8;
  undefined8 local_8a0;
  char *local_898;
  undefined1 local_890;
  undefined8 local_888;
  char *local_880;
  undefined1 local_878;
  undefined8 local_870;
  char *local_868;
  undefined1 local_860;
  undefined8 local_858;
  char *local_850;
  undefined1 local_848;
  undefined8 local_840;
  char *local_838;
  undefined1 local_830;
  undefined8 local_828;
  char *local_820;
  undefined1 local_818;
  undefined8 local_810;
  char *local_808;
  undefined1 local_800;
  undefined8 local_7f8;
  char *local_7f0;
  undefined1 local_7e8;
  undefined8 local_7e0;
  char *local_7d8;
  undefined1 local_7d0;
  undefined8 local_7c8;
  char *local_7c0;
  undefined1 local_7b8;
  undefined8 local_7b0;
  char *local_7a8;
  undefined1 local_7a0;
  undefined8 local_798;
  char *local_790;
  undefined1 local_788;
  undefined8 local_780;
  char *local_778;
  undefined1 local_770;
  undefined8 local_768;
  char *local_760;
  undefined1 local_758;
  undefined8 local_750;
  char *local_748;
  undefined1 local_740;
  undefined8 local_738;
  char *local_730;
  undefined1 local_728;
  undefined8 local_720;
  char *local_718;
  undefined1 local_710;
  undefined8 local_708;
  char *local_700;
  undefined1 local_6f8;
  undefined8 local_6f0;
  char *local_6e8;
  undefined1 local_6e0;
  undefined8 local_6d8;
  char *local_6d0;
  undefined1 local_6c8;
  undefined8 local_6c0;
  char *local_6b8;
  undefined1 local_6b0;
  undefined8 local_6a8;
  char *local_6a0;
  undefined1 local_698;
  undefined8 local_690;
  char *local_688;
  undefined1 local_680;
  undefined8 local_678;
  char *local_670;
  undefined1 local_668;
  undefined8 local_660;
  char *local_658;
  undefined1 local_650;
  undefined8 local_648;
  char *local_640;
  undefined1 local_638;
  undefined8 local_630;
  char *local_628;
  undefined1 local_620;
  undefined8 local_618;
  char *local_610;
  undefined1 local_608;
  undefined8 local_600;
  char *local_5f8;
  undefined1 local_5f0;
  undefined8 local_5e8;
  char *local_5e0;
  undefined1 local_5d8;
  undefined8 local_5d0;
  char *local_5c8;
  undefined1 local_5c0;
  undefined8 local_5b8;
  char *local_5b0;
  undefined1 local_5a8;
  undefined8 local_5a0;
  char *local_598;
  undefined1 local_590;
  undefined8 local_588;
  char *local_580;
  undefined1 local_578;
  undefined8 local_570;
  char *local_568;
  undefined1 local_560;
  undefined8 local_558;
  char *local_550;
  undefined1 local_548;
  undefined8 local_540;
  char *local_538;
  undefined1 local_530;
  undefined8 local_528;
  char *local_520;
  undefined1 local_518;
  undefined8 local_510;
  char *local_508;
  undefined1 local_500;
  undefined8 local_4f8;
  char *local_4f0;
  undefined1 local_4e8;
  undefined8 local_4e0;
  char *local_4d8;
  undefined1 local_4d0;
  undefined8 local_4c8;
  char *local_4c0;
  undefined1 local_4b8;
  undefined8 local_4b0;
  char *local_4a8;
  undefined1 local_4a0;
  undefined8 local_498;
  char *local_490;
  undefined1 local_488;
  undefined8 local_480;
  char *local_478;
  undefined1 local_470;
  undefined8 local_468;
  char *local_460;
  undefined1 local_458;
  undefined8 local_450;
  char *local_448;
  undefined1 local_440;
  undefined8 local_438;
  char *local_430;
  undefined1 local_428;
  undefined8 local_420;
  char *local_418;
  undefined1 local_410;
  undefined8 local_408;
  char *local_400;
  undefined1 local_3f8;
  undefined8 local_3f0;
  char *local_3e8;
  undefined1 local_3e0;
  undefined8 local_3d8;
  char *local_3d0;
  undefined1 local_3c8;
  undefined8 local_3c0;
  char *local_3b8;
  undefined1 local_3b0;
  undefined8 local_3a8;
  char *local_3a0;
  undefined1 local_398;
  undefined8 local_390;
  char *local_388;
  undefined1 local_380;
  undefined8 local_378;
  char *local_370;
  undefined1 local_368;
  undefined8 local_360;
  char *local_358;
  undefined1 local_350;
  undefined8 local_348;
  char *local_340;
  undefined1 local_338;
  undefined8 local_330;
  char *local_328;
  undefined1 local_320;
  undefined8 local_318;
  char *local_310;
  undefined1 local_308;
  undefined8 local_300;
  char *local_2f8;
  undefined1 local_2f0;
  undefined8 local_2e8;
  char *local_2e0;
  undefined1 local_2d8;
  undefined8 local_2d0;
  char *local_2c8;
  undefined1 local_2c0;
  undefined8 local_2b8;
  char *local_2b0;
  undefined1 local_2a8;
  undefined8 local_2a0;
  char *local_298;
  undefined1 local_290;
  undefined8 local_288;
  char *local_280;
  undefined1 local_278;
  undefined8 local_270;
  char *local_268;
  undefined1 local_260;
  undefined8 local_258;
  char *local_250;
  undefined1 local_248;
  undefined8 local_240;
  char *local_238;
  undefined1 local_230;
  undefined8 local_228;
  char *local_220;
  undefined1 local_218;
  undefined8 local_210;
  char *local_208;
  undefined1 local_200;
  undefined8 local_1f8;
  char *local_1f0;
  undefined1 local_1e8;
  undefined8 local_1e0;
  char *local_1d8;
  undefined1 local_1d0;
  undefined8 local_1c8;
  char *local_1c0;
  undefined1 local_1b8;
  undefined8 local_1b0;
  char *local_1a8;
  undefined1 local_1a0;
  undefined8 local_198;
  char *local_190;
  undefined1 local_188;
  undefined8 local_180;
  char *local_178;
  undefined1 local_170;
  undefined8 local_168;
  char *local_160;
  undefined1 local_158;
  undefined8 local_150;
  char *local_148;
  undefined1 local_140;
  undefined8 local_138;
  char *local_130;
  undefined1 local_128;
  undefined8 local_120;
  char *local_118;
  undefined1 local_110;
  undefined8 local_108;
  char *local_100;
  undefined1 local_f8;
  undefined8 local_f0;
  char *local_e8;
  undefined1 local_e0;
  undefined8 local_d8;
  char *local_d0;
  undefined1 local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined1 local_b0;
  undefined8 local_a8;
  char *local_a0;
  undefined1 local_98;
  undefined8 local_90;
  char *local_88;
  undefined1 local_80;
  undefined8 local_78;
  char *local_70;
  undefined1 local_68;
  undefined8 local_60;
  char *local_58;
  undefined1 local_50;
  undefined8 local_48;
  char *local_40;
  
  local_1388.first = 'b';
  local_1388.second.m_size = 5;
  local_1388.second.m_data = "break";
  local_1370 = 99;
  local_1368 = 0x1d;
  local_1360 = "cmake_host_system_information";
  local_1358 = 99;
  local_1350 = 0x16;
  local_1348 = "cmake_minimum_required";
  local_1340 = 99;
  local_1338 = 0x15;
  local_1330 = "cmake_parse_arguments";
  local_1328 = 99;
  local_1320 = 0xc;
  local_1318 = "cmake_policy";
  local_1310 = 99;
  local_1308 = 0xe;
  local_1300 = "configure_file";
  local_12f8 = 99;
  local_12f0 = 8;
  local_12e8 = "continue";
  local_12e0 = 0x65;
  local_12d8 = 6;
  local_12d0 = "elseif";
  local_12c8 = 0x65;
  local_12c0 = 4;
  local_12b8 = "else";
  local_12b0 = 0x65;
  local_12a8 = 10;
  local_12a0 = "endforeach";
  local_1298 = 0x65;
  local_1290 = 0xb;
  local_1288 = "endfunction";
  local_1280 = 0x65;
  local_1278 = 5;
  local_1270 = "endif";
  local_1268 = 0x65;
  local_1260 = 8;
  local_1258 = "endmacro";
  local_1250 = 0x65;
  local_1248 = 8;
  local_1240 = "endwhile";
  local_1238 = 0x65;
  local_1230 = 0xf;
  local_1228 = "execute_process";
  local_1220 = 0x66;
  local_1218 = 4;
  local_1210 = "file";
  local_1208 = 0x66;
  local_1200 = 9;
  local_11f8 = "find_file";
  local_11f0 = 0x66;
  local_11e8 = 0xc;
  local_11e0 = "find_library";
  local_11d8 = 0x66;
  local_11d0 = 0xc;
  local_11c8 = "find_package";
  local_11c0 = 0x66;
  local_11b8 = 9;
  local_11b0 = "find_path";
  local_11a8 = 0x66;
  local_11a0 = 0xc;
  local_1198 = "find_program";
  local_1190 = 0x66;
  local_1188 = 7;
  local_1180 = "foreach";
  local_1178 = 0x66;
  local_1170 = 8;
  local_1168 = "function";
  local_1160 = 0x67;
  local_1158 = 0x12;
  local_1150 = "get_cmake_property";
  local_1148 = 0x67;
  local_1140 = 0x16;
  local_1138 = "get_directory_property";
  local_1130 = 0x67;
  local_1128 = 0x16;
  local_1120 = "get_filename_component";
  local_1118 = 0x67;
  local_1110 = 0xc;
  local_1108 = "get_property";
  local_1100 = 0x69;
  local_10f8 = 2;
  local_10f0 = "if";
  local_10e8 = 0x69;
  local_10e0 = 7;
  local_10d8 = "include";
  local_10d0 = 0x69;
  local_10c8 = 0xd;
  local_10c0 = "include_guard";
  local_10b8 = 0x6c;
  local_10b0 = 4;
  local_10a8 = "list";
  local_10a0 = 0x6d;
  local_1098 = 5;
  local_1090 = "macro";
  local_1088 = 0x6d;
  local_1080 = 0x10;
  local_1078 = "mark_as_advanced";
  local_1070 = 0x6d;
  local_1068 = 4;
  local_1060 = "math";
  local_1058 = 0x6d;
  local_1050 = 7;
  local_1048 = "message";
  local_1040 = 0x6f;
  local_1038 = 6;
  local_1030 = "option";
  local_1028 = 0x72;
  local_1020 = 6;
  local_1018 = "return";
  local_1010 = 0x73;
  local_1008 = 0x12;
  local_1000 = "separate_arguments";
  local_ff8 = 0x73;
  local_ff0 = 0x18;
  local_fe8 = "set_directory_properties";
  local_fe0 = 0x73;
  local_fd8 = 3;
  local_fd0 = "set";
  local_fc8 = 0x73;
  local_fc0 = 0xc;
  local_fb8 = "set_property";
  local_fb0 = 0x73;
  local_fa8 = 9;
  local_fa0 = "site_name";
  local_f98 = 0x73;
  local_f90 = 6;
  local_f88 = "string";
  local_f80 = 0x75;
  local_f78 = 5;
  local_f70 = "unset";
  local_f68 = 0x76;
  local_f60 = 0xe;
  local_f58 = "variable_watch";
  local_f50 = 0x77;
  local_f48 = 5;
  local_f40 = "while";
  local_f38 = 0x61;
  local_f30 = 0x17;
  local_f28 = "add_compile_definitions";
  local_f20 = 0x61;
  local_f18 = 0x13;
  local_f10 = "add_compile_options";
  local_f08 = 0x41;
  local_f00 = 0x13;
  local_ef8 = "ADD_COMPILE_OPTIONS";
  local_ef0 = 0x61;
  local_ee8 = 0x12;
  local_ee0 = "add_custom_command";
  local_ed8 = 0x61;
  local_ed0 = 0x11;
  local_ec8 = "add_custom_target";
  local_ec0 = 0x61;
  local_eb8 = 0xf;
  local_eb0 = "add_definitions";
  local_ea8 = 0x61;
  local_ea0 = 0x10;
  local_e98 = "add_dependencies";
  local_e90 = 0x61;
  local_e88 = 0xe;
  local_e80 = "add_executable";
  local_e78 = 0x61;
  local_e70 = 0xb;
  local_e68 = "add_library";
  local_e60 = 0x61;
  local_e58 = 0x10;
  local_e50 = "add_link_options";
  local_e48 = 0x61;
  local_e40 = 0x10;
  local_e38 = "add_subdirectory";
  local_e30 = 0x61;
  local_e28 = 8;
  local_e20 = "add_test";
  local_e18 = 0x61;
  local_e10 = 0x14;
  local_e08 = "aux_source_directory";
  local_e00 = 0x62;
  local_df8 = 0xd;
  local_df0 = "build_command";
  local_de8 = 99;
  local_de0 = 0x16;
  local_dd8 = "create_test_sourcelist";
  local_dd0 = 100;
  local_dc8 = 0xf;
  local_dc0 = "define_property";
  local_db8 = 0x65;
  local_db0 = 0xf;
  local_da8 = "enable_language";
  local_da0 = 0x65;
  local_d98 = 0xe;
  local_d90 = "enable_testing";
  local_d88 = 0x65;
  local_d80 = 6;
  local_d78 = "export";
  local_d70 = 0x66;
  local_d68 = 0xc;
  local_d60 = "fltk_wrap_ui";
  local_d58 = 0x67;
  local_d50 = 0x18;
  local_d48 = "get_source_file_property";
  local_d40 = 0x67;
  local_d38 = 0x13;
  local_d30 = "get_target_property";
  local_d28 = 0x67;
  local_d20 = 0x11;
  local_d18 = "get_test_property";
  local_d10 = 0x69;
  local_d08 = 0x13;
  local_d00 = "include_directories";
  local_cf8 = 0x69;
  local_cf0 = 0x1a;
  local_ce8 = "include_external_msproject";
  local_ce0 = 0x69;
  local_cd8 = 0x1a;
  local_cd0 = "include_regular_expression";
  local_cc8 = 0x69;
  local_cc0 = 7;
  local_cb8 = "install";
  local_cb0 = 0x6c;
  local_ca8 = 0x10;
  local_ca0 = "link_directories";
  local_c98 = 0x6c;
  local_c90 = 0xe;
  local_c88 = "link_libraries";
  local_c80 = 0x6c;
  local_c78 = 10;
  local_c70 = "load_cache";
  local_c68 = 0x70;
  local_c60 = 7;
  local_c58 = "project";
  local_c50 = 0x71;
  local_c48 = 0xb;
  local_c40 = "qt_wrap_cpp";
  local_c38 = 0x71;
  local_c30 = 10;
  local_c28 = "qt_wrap_ui";
  local_c20 = 0x72;
  local_c18 = 0x12;
  local_c10 = "remove_definitions";
  local_c08 = 0x73;
  local_c00 = 0x1b;
  local_bf8 = "set_source_files_properties";
  local_bf0 = 0x73;
  local_be8 = 0x15;
  local_be0 = "set_target_properties";
  local_bd8 = 0x73;
  local_bd0 = 0x14;
  local_bc8 = "set_tests_properties";
  local_bc0 = 0x73;
  local_bb8 = 0xc;
  local_bb0 = "source_group";
  local_ba8 = 0x74;
  local_ba0 = 0x1a;
  local_b98 = "target_compile_definitions";
  local_b90 = 0x74;
  local_b88 = 0x17;
  local_b80 = "target_compile_features";
  local_b78 = 0x74;
  local_b70 = 0x16;
  local_b68 = "target_compile_options";
  local_b60 = 0x74;
  local_b58 = 0x1a;
  local_b50 = "target_include_directories";
  local_b48 = 0x74;
  local_b40 = 0x17;
  local_b38 = "target_link_directories";
  local_b30 = 0x74;
  local_b28 = 0x15;
  local_b20 = "target_link_libraries";
  local_b18 = 0x74;
  local_b10 = 0x13;
  local_b08 = "target_link_options";
  local_b00 = 0x74;
  local_af8 = 0xe;
  local_af0 = "target_sources";
  local_ae8 = 0x74;
  local_ae0 = 0xb;
  local_ad8 = "try_compile";
  local_ad0 = 0x74;
  local_ac8 = 7;
  local_ac0 = "try_run";
  local_ab8 = 99;
  local_ab0 = 0xb;
  local_aa8 = "ctest_build";
  local_aa0 = 99;
  local_a98 = 0xf;
  local_a90 = "ctest_configure";
  local_a88 = 99;
  local_a80 = 0xe;
  local_a78 = "ctest_coverage";
  local_a70 = 99;
  local_a68 = 0x1c;
  local_a60 = "ctest_empty_binary_directory";
  local_a58 = 99;
  local_a50 = 0xe;
  local_a48 = "ctest_memcheck";
  local_a40 = 99;
  local_a38 = 0x17;
  local_a30 = "ctest_read_custom_files";
  local_a28 = 99;
  local_a20 = 0x10;
  local_a18 = "ctest_run_script";
  local_a10 = 99;
  local_a08 = 0xb;
  local_a00 = "ctest_sleep";
  local_9f8 = 99;
  local_9f0 = 0xb;
  local_9e8 = "ctest_start";
  local_9e0 = 99;
  local_9d8 = 0xc;
  local_9d0 = "ctest_submit";
  local_9c8 = 99;
  local_9c0 = 10;
  local_9b8 = "ctest_test";
  local_9b0 = 99;
  local_9a8 = 0xc;
  local_9a0 = "ctest_update";
  local_998 = 99;
  local_990 = 0xc;
  local_988 = "ctest_upload";
  local_980 = 0x62;
  local_978 = 10;
  local_970 = "build_name";
  local_968 = 0x65;
  local_960 = 0xc;
  local_958 = "exec_program";
  local_950 = 0x65;
  local_948 = 0x1b;
  local_940 = "export_library_dependencies";
  local_938 = 0x69;
  local_930 = 0xd;
  local_928 = "install_files";
  local_920 = 0x69;
  local_918 = 0x10;
  local_910 = "install_programs";
  local_908 = 0x69;
  local_900 = 0xf;
  local_8f8 = "install_targets";
  local_8f0 = 0x6c;
  local_8e8 = 0xc;
  local_8e0 = "load_command";
  local_8d8 = 0x6d;
  local_8d0 = 0xe;
  local_8c8 = "make_directory";
  local_8c0 = 0x6f;
  local_8b8 = 0x15;
  local_8b0 = "output_required_files";
  local_8a8 = 0x72;
  local_8a0 = 6;
  local_898 = "remove";
  local_890 = 0x73;
  local_888 = 0xe;
  local_880 = "subdir_depends";
  local_878 = 0x73;
  local_870 = 7;
  local_868 = "subdirs";
  local_860 = 0x75;
  local_858 = 0x10;
  local_850 = "use_mangled_mesa";
  local_848 = 0x75;
  local_840 = 0xe;
  local_838 = "utility_source";
  local_830 = 0x76;
  local_828 = 0x11;
  local_820 = "variable_requires";
  local_818 = 0x77;
  local_810 = 10;
  local_808 = "write_file";
  local_800 = 0x71;
  local_7f8 = 0xf;
  local_7f0 = "qt5_use_modules";
  local_7e8 = 0x71;
  local_7e0 = 0xf;
  local_7d8 = "qt5_use_package";
  local_7d0 = 0x71;
  local_7c8 = 0xc;
  local_7c0 = "qt5_wrap_cpp";
  local_7b8 = 0x61;
  local_7b0 = 3;
  local_7a8 = "and";
  local_7a0 = 0x6f;
  local_798 = 2;
  local_790 = "or";
  local_788 = 0x6e;
  local_780 = 3;
  local_778 = "not";
  local_770 = 99;
  local_768 = 7;
  local_760 = "command";
  local_758 = 0x70;
  local_750 = 6;
  local_748 = "policy";
  local_740 = 0x74;
  local_738 = 6;
  local_730 = "target";
  local_728 = 0x74;
  local_720 = 4;
  local_718 = "test";
  local_710 = 0x65;
  local_708 = 6;
  local_700 = "exists";
  local_6f8 = 0x69;
  local_6f0 = 0xd;
  local_6e8 = "is_newer_than";
  local_6e0 = 0x69;
  local_6d8 = 0xc;
  local_6d0 = "is_directory";
  local_6c8 = 0x69;
  local_6c0 = 10;
  local_6b8 = "is_symlink";
  local_6b0 = 0x69;
  local_6a8 = 0xb;
  local_6a0 = "is_absolute";
  local_698 = 0x6d;
  local_690 = 7;
  local_688 = "matches";
  local_680 = 0x6c;
  local_678 = 4;
  local_670 = "less";
  local_668 = 0x67;
  local_660 = 7;
  local_658 = "greater";
  local_650 = 0x65;
  local_648 = 5;
  local_640 = "equal";
  local_638 = 0x6c;
  local_630 = 10;
  local_628 = "less_equal";
  local_620 = 0x67;
  local_618 = 0xd;
  local_610 = "greater_equal";
  local_608 = 0x73;
  local_600 = 7;
  local_5f8 = "strless";
  local_5f0 = 0x73;
  local_5e8 = 10;
  local_5e0 = "strgreater";
  local_5d8 = 0x73;
  local_5d0 = 8;
  local_5c8 = "strequal";
  local_5c0 = 0x73;
  local_5b8 = 0xd;
  local_5b0 = "strless_equal";
  local_5a8 = 0x73;
  local_5a0 = 0x10;
  local_598 = "strgreater_equal";
  local_590 = 0x76;
  local_588 = 0xc;
  local_580 = "version_less";
  local_578 = 0x76;
  local_570 = 0xf;
  local_568 = "version_greater";
  local_560 = 0x76;
  local_558 = 0xd;
  local_550 = "version_equal";
  local_548 = 0x76;
  local_540 = 0x12;
  local_538 = "version_less_equal";
  local_530 = 0x76;
  local_528 = 0x15;
  local_520 = "version_greater_equal";
  local_518 = 0x69;
  local_510 = 7;
  local_508 = "in_list";
  local_500 = 100;
  local_4f8 = 7;
  local_4f0 = "defined";
  list._M_len = 0x9c;
  list._M_array = &local_1388;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_1398,list);
  QMultiHash<char,_QLatin1String>::operator=(&cmake_keywords,&QStack_1398);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_1398);
  local_1388.first = '\0';
  local_1388._1_7_ = 0;
  local_1388.second.m_size = 0;
  QMultiHash<char,_QLatin1String>::operator=
            (&cmake_types,(QMultiHash<char,_QLatin1String> *)&local_1388);
  QMultiHash<char,_QLatin1String>::~QMultiHash((QMultiHash<char,_QLatin1String> *)&local_1388);
  local_1388.first = 'o';
  local_1388.second.m_size = 2;
  local_1388.second.m_data = "on";
  local_1370 = 0x6f;
  local_1368 = 3;
  local_1360 = "off";
  local_1358 = 0x4f;
  local_1350 = 2;
  local_1348 = "ON";
  local_1340 = 0x4f;
  local_1338 = 3;
  local_1330 = "OFF";
  local_1328 = 0x74;
  local_1320 = 4;
  local_1318 = "true";
  local_1310 = 0x66;
  local_1308 = 5;
  local_1300 = "false";
  local_12f8 = 0x54;
  local_12f0 = 4;
  local_12e8 = "TRUE";
  local_12e0 = 0x46;
  local_12d8 = 5;
  local_12d0 = "FALSE";
  list_00._M_len = 8;
  list_00._M_array = &local_1388;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_1398,list_00);
  QMultiHash<char,_QLatin1String>::operator=(&cmake_literals,&QStack_1398);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_1398);
  local_1388.first = 'A';
  local_1388.second.m_size = 0x1e;
  local_1388.second.m_data = "ALLOW_DUPLICATE_CUSTOM_TARGETS";
  local_1370 = 0x41;
  local_1368 = 0x16;
  local_1360 = "AUTOGEN_TARGETS_FOLDER";
  local_1358 = 0x41;
  local_1350 = 0x16;
  local_1348 = "AUTOMOC_TARGETS_FOLDER";
  local_1340 = 0x44;
  local_1338 = 0x14;
  local_1330 = "DEBUG_CONFIGURATIONS";
  local_1328 = 0x44;
  local_1320 = 0x11;
  local_1318 = "DISABLED_FEATURES";
  local_1310 = 0x45;
  local_1308 = 0x10;
  local_1300 = "ENABLED_FEATURES";
  local_12f8 = 0x45;
  local_12f0 = 0x11;
  local_12e8 = "ENABLED_LANGUAGES";
  local_12e0 = 0x46;
  local_12d8 = 0x1c;
  local_12d0 = "FIND_LIBRARY_USE_LIB64_PATHS";
  local_12c8 = 0x46;
  local_12c0 = 0x23;
  local_12b8 = "FIND_LIBRARY_USE_OPENBSD_VERSIONING";
  local_12b0 = 0x47;
  local_12a8 = 0x19;
  local_12a0 = "GLOBAL_DEPENDS_DEBUG_MODE";
  local_1298 = 0x47;
  local_1290 = 0x18;
  local_1288 = "GLOBAL_DEPENDS_NO_CYCLES";
  local_1280 = 0x49;
  local_1278 = 0xe;
  local_1270 = "IN_TRY_COMPILE";
  local_1268 = 0x50;
  local_1260 = 0xe;
  local_1258 = "PACKAGES_FOUND";
  local_1250 = 0x50;
  local_1248 = 0x12;
  local_1240 = "PACKAGES_NOT_FOUND";
  local_1238 = 0x4a;
  local_1230 = 9;
  local_1228 = "JOB_POOLS";
  local_1220 = 0x50;
  local_1218 = 0x19;
  local_1210 = "PREDEFINED_TARGETS_FOLDER";
  local_1208 = 0x45;
  local_1200 = 0x15;
  local_11f8 = "ECLIPSE_EXTRA_NATURES";
  local_11f0 = 0x52;
  local_11e8 = 0x1b;
  local_11e0 = "REPORT_UNDEFINED_PROPERTIES";
  local_11d8 = 0x52;
  local_11d0 = 0x13;
  local_11c8 = "RULE_LAUNCH_COMPILE";
  local_11c0 = 0x52;
  local_11b8 = 0x12;
  local_11b0 = "RULE_LAUNCH_CUSTOM";
  local_11a8 = 0x52;
  local_11a0 = 0x10;
  local_1198 = "RULE_LAUNCH_LINK";
  local_1190 = 0x52;
  local_1188 = 0xd;
  local_1180 = "RULE_MESSAGES";
  local_1178 = 0x54;
  local_1170 = 0x22;
  local_1168 = "TARGET_ARCHIVES_MAY_BE_SHARED_LIBS";
  local_1160 = 0x54;
  local_1158 = 0x1b;
  local_1150 = "TARGET_SUPPORTS_SHARED_LIBS";
  local_1148 = 0x55;
  local_1140 = 0xb;
  local_1138 = "USE_FOLDERS";
  local_1130 = 0x41;
  local_1128 = 0x1b;
  local_1120 = "ADDITIONAL_MAKE_CLEAN_FILES";
  local_1118 = 0x43;
  local_1110 = 0xf;
  local_1108 = "CACHE_VARIABLES";
  local_1100 = 0x43;
  local_10f8 = 0xf;
  local_10f0 = "CLEAN_NO_CUSTOM";
  local_10e8 = 0x43;
  local_10e0 = 0x17;
  local_10d8 = "CMAKE_CONFIGURE_DEPENDS";
  local_10d0 = 0x43;
  local_10c8 = 0x13;
  local_10c0 = "COMPILE_DEFINITIONS";
  local_10b8 = 0x43;
  local_10b0 = 0xf;
  local_10a8 = "COMPILE_OPTIONS";
  local_10a0 = 0x44;
  local_1098 = 0xb;
  local_1090 = "DEFINITIONS";
  local_1088 = 0x45;
  local_1080 = 0x10;
  local_1078 = "EXCLUDE_FROM_ALL";
  local_1070 = 0x49;
  local_1068 = 0x22;
  local_1060 = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
  local_1058 = 0x49;
  local_1050 = 0x13;
  local_1048 = "INCLUDE_DIRECTORIES";
  local_1040 = 0x49;
  local_1038 = 0x1a;
  local_1030 = "INCLUDE_REGULAR_EXPRESSION";
  local_1028 = 0x49;
  local_1020 = 0x1c;
  local_1018 = "INTERPROCEDURAL_OPTIMIZATION";
  local_1010 = 0x4c;
  local_1008 = 0x10;
  local_1000 = "LINK_DIRECTORIES";
  local_ff8 = 0x4c;
  local_ff0 = 0xe;
  local_fe8 = "LISTFILE_STACK";
  local_fe0 = 0x4d;
  local_fd8 = 6;
  local_fd0 = "MACROS";
  local_fc8 = 0x50;
  local_fc0 = 0x10;
  local_fb8 = "PARENT_DIRECTORY";
  local_fb0 = 0x52;
  local_fa8 = 0x13;
  local_fa0 = "RULE_LAUNCH_COMPILE";
  local_f98 = 0x52;
  local_f90 = 0x12;
  local_f88 = "RULE_LAUNCH_CUSTOM";
  local_f80 = 0x52;
  local_f78 = 0x10;
  local_f70 = "RULE_LAUNCH_LINK";
  local_f68 = 0x54;
  local_f60 = 0x11;
  local_f58 = "TEST_INCLUDE_FILE";
  local_f50 = 0x56;
  local_f48 = 9;
  local_f40 = "VARIABLES";
  local_f38 = 0x41;
  local_f30 = 0xe;
  local_f28 = "ALIASED_TARGET";
  local_f20 = 0x41;
  local_f18 = 0x18;
  local_f10 = "ARCHIVE_OUTPUT_DIRECTORY";
  local_f08 = 0x41;
  local_f00 = 0x13;
  local_ef8 = "ARCHIVE_OUTPUT_NAME";
  local_ef0 = 0x41;
  local_ee8 = 0x16;
  local_ee0 = "AUTOGEN_TARGET_DEPENDS";
  local_ed8 = 0x41;
  local_ed0 = 0x13;
  local_ec8 = "AUTOMOC_MOC_OPTIONS";
  local_ec0 = 0x41;
  local_eb8 = 7;
  local_eb0 = "AUTOMOC";
  local_ea8 = 0x41;
  local_ea0 = 7;
  local_e98 = "AUTOUIC";
  local_e90 = 0x41;
  local_e88 = 0xf;
  local_e80 = "AUTOUIC_OPTIONS";
  local_e78 = 0x41;
  local_e70 = 7;
  local_e68 = "AUTORCC";
  local_e60 = 0x41;
  local_e58 = 0xf;
  local_e50 = "AUTORCC_OPTIONS";
  local_e48 = 0x42;
  local_e40 = 0x18;
  local_e38 = "BUILD_WITH_INSTALL_RPATH";
  local_e30 = 0x42;
  local_e28 = 0x10;
  local_e20 = "BUNDLE_EXTENSION";
  local_e18 = 0x42;
  local_e10 = 6;
  local_e08 = "BUNDLE";
  local_e00 = 0x43;
  local_df8 = 0x19;
  local_df0 = "COMPATIBLE_INTERFACE_BOOL";
  local_de8 = 0x43;
  local_de0 = 0x1f;
  local_dd8 = "COMPATIBLE_INTERFACE_NUMBER_MAX";
  local_dd0 = 0x43;
  local_dc8 = 0x1f;
  local_dc0 = "COMPATIBLE_INTERFACE_NUMBER_MIN";
  local_db8 = 0x43;
  local_db0 = 0x1b;
  local_da8 = "COMPATIBLE_INTERFACE_STRING";
  local_da0 = 0x43;
  local_d98 = 0x13;
  local_d90 = "COMPILE_DEFINITIONS";
  local_d88 = 0x43;
  local_d80 = 0xd;
  local_d78 = "COMPILE_FLAGS";
  local_d70 = 0x43;
  local_d68 = 0xf;
  local_d60 = "COMPILE_OPTIONS";
  local_d58 = 0x44;
  local_d50 = 0xd;
  local_d48 = "DEBUG_POSTFIX";
  local_d40 = 0x44;
  local_d38 = 0xd;
  local_d30 = "DEFINE_SYMBOL";
  local_d28 = 0x45;
  local_d20 = 10;
  local_d18 = "EchoString";
  local_d10 = 0x45;
  local_d08 = 0xe;
  local_d00 = "ENABLE_EXPORTS";
  local_cf8 = 0x45;
  local_cf0 = 0x10;
  local_ce8 = "EXCLUDE_FROM_ALL";
  local_ce0 = 0x45;
  local_cd8 = 0x1a;
  local_cd0 = "EXCLUDE_FROM_DEFAULT_BUILD";
  local_cc8 = 0x45;
  local_cc0 = 0xb;
  local_cb8 = "EXPORT_NAME";
  local_cb0 = 0x46;
  local_ca8 = 6;
  local_ca0 = "FOLDER";
  local_c98 = 0x46;
  local_c90 = 0xe;
  local_c88 = "Fortran_FORMAT";
  local_c80 = 0x46;
  local_c78 = 0x18;
  local_c70 = "Fortran_MODULE_DIRECTORY";
  local_c68 = 0x46;
  local_c60 = 9;
  local_c58 = "FRAMEWORK";
  local_c50 = 0x47;
  local_c48 = 0x13;
  local_c40 = "GENERATOR_FILE_NAME";
  local_c38 = 0x47;
  local_c30 = 7;
  local_c28 = "GNUtoMS";
  local_c20 = 0x48;
  local_c18 = 7;
  local_c10 = "HAS_CXX";
  local_c08 = 0x49;
  local_c00 = 0x22;
  local_bf8 = "IMPLICIT_DEPENDS_INCLUDE_TRANSFORM";
  local_bf0 = 0x49;
  local_be8 = 0x17;
  local_be0 = "IMPORTED_CONFIGURATIONS";
  local_bd8 = 0x49;
  local_bd0 = 0xf;
  local_bc8 = "IMPORTED_IMPLIB";
  local_bc0 = 0x49;
  local_bb8 = 0x21;
  local_bb0 = "IMPORTED_LINK_DEPENDENT_LIBRARIES";
  local_ba8 = 0x49;
  local_ba0 = 0x21;
  local_b98 = "IMPORTED_LINK_INTERFACE_LANGUAGES";
  local_b90 = 0x49;
  local_b88 = 0x21;
  local_b80 = "IMPORTED_LINK_INTERFACE_LIBRARIES";
  local_b78 = 0x49;
  local_b70 = 0x24;
  local_b68 = "IMPORTED_LINK_INTERFACE_MULTIPLICITY";
  local_b60 = 0x49;
  local_b58 = 0x11;
  local_b50 = "IMPORTED_LOCATION";
  local_b48 = 0x49;
  local_b40 = 0x12;
  local_b38 = "IMPORTED_NO_SONAME";
  local_b30 = 0x49;
  local_b28 = 8;
  local_b20 = "IMPORTED";
  local_b18 = 0x49;
  local_b10 = 0xf;
  local_b08 = "IMPORTED_SONAME";
  local_b00 = 0x49;
  local_af8 = 0xd;
  local_af0 = "IMPORT_PREFIX";
  local_ae8 = 0x49;
  local_ae0 = 0xd;
  local_ad8 = "IMPORT_SUFFIX";
  local_ad0 = 0x49;
  local_ac8 = 0x13;
  local_ac0 = "INCLUDE_DIRECTORIES";
  local_ab8 = 0x49;
  local_ab0 = 0x10;
  local_aa8 = "INSTALL_NAME_DIR";
  local_aa0 = 0x49;
  local_a98 = 0xd;
  local_a90 = "INSTALL_RPATH";
  local_a88 = 0x49;
  local_a80 = 0x1b;
  local_a78 = "INSTALL_RPATH_USE_LINK_PATH";
  local_a70 = 0x49;
  local_a68 = 0x19;
  local_a60 = "INTERFACE_AUTOUIC_OPTIONS";
  local_a58 = 0x49;
  local_a50 = 0x1d;
  local_a48 = "INTERFACE_COMPILE_DEFINITIONS";
  local_a40 = 0x49;
  local_a38 = 0x19;
  local_a30 = "INTERFACE_COMPILE_OPTIONS";
  local_a28 = 0x49;
  local_a20 = 0x1d;
  local_a18 = "INTERFACE_INCLUDE_DIRECTORIES";
  local_a10 = 0x49;
  local_a08 = 0x18;
  local_a00 = "INTERFACE_LINK_LIBRARIES";
  local_9f8 = 0x49;
  local_9f0 = 0x23;
  local_9e8 = "INTERFACE_POSITION_INDEPENDENT_CODE";
  local_9e0 = 0x49;
  local_9d8 = 0x24;
  local_9d0 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
  local_9c8 = 0x49;
  local_9c0 = 0x1c;
  local_9b8 = "INTERPROCEDURAL_OPTIMIZATION";
  local_9b0 = 0x4a;
  local_9a8 = 0x10;
  local_9a0 = "JOB_POOL_COMPILE";
  local_998 = 0x4a;
  local_990 = 0xd;
  local_988 = "JOB_POOL_LINK";
  local_980 = 0x4c;
  local_978 = 6;
  local_970 = "LABELS";
  local_968 = 0x4c;
  local_960 = 0x18;
  local_958 = "LIBRARY_OUTPUT_DIRECTORY";
  local_950 = 0x4c;
  local_948 = 0x13;
  local_940 = "LIBRARY_OUTPUT_NAME";
  local_938 = 0x4c;
  local_930 = 0x16;
  local_928 = "LINK_DEPENDS_NO_SHARED";
  local_920 = 0x4c;
  local_918 = 0xc;
  local_910 = "LINK_DEPENDS";
  local_908 = 0x4c;
  local_900 = 0xf;
  local_8f8 = "LINKER_LANGUAGE";
  local_8f0 = 0x4c;
  local_8e8 = 10;
  local_8e0 = "LINK_FLAGS";
  local_8d8 = 0x4c;
  local_8d0 = 0x18;
  local_8c8 = "LINK_INTERFACE_LIBRARIES";
  local_8c0 = 0x4c;
  local_8b8 = 0x1b;
  local_8b0 = "LINK_INTERFACE_MULTIPLICITY";
  local_8a8 = 0x4c;
  local_8a0 = 0xe;
  local_898 = "LINK_LIBRARIES";
  local_890 = 0x4c;
  local_888 = 0x16;
  local_880 = "LINK_SEARCH_END_STATIC";
  local_878 = 0x4c;
  local_870 = 0x18;
  local_868 = "LINK_SEARCH_START_STATIC";
  local_860 = 0x4c;
  local_858 = 8;
  local_850 = "LOCATION";
  local_848 = 0x4d;
  local_840 = 0x18;
  local_838 = "MACOSX_BUNDLE_INFO_PLIST";
  local_830 = 0x4d;
  local_828 = 0xd;
  local_820 = "MACOSX_BUNDLE";
  local_818 = 0x4d;
  local_810 = 0x1b;
  local_808 = "MACOSX_FRAMEWORK_INFO_PLIST";
  local_800 = 0x4d;
  local_7f8 = 0xc;
  local_7f0 = "MACOSX_RPATH";
  local_7e8 = 0x4e;
  local_7e0 = 9;
  local_7d8 = "NO_SONAME";
  local_7d0 = 0x4e;
  local_7c8 = 0x17;
  local_7c0 = "NO_SYSTEM_FROM_IMPORTED";
  local_7b8 = 0x4f;
  local_7b0 = 0x11;
  local_7a8 = "OSX_ARCHITECTURES";
  local_7a0 = 0x4f;
  local_798 = 0xb;
  local_790 = "OUTPUT_NAME";
  local_788 = 0x50;
  local_780 = 8;
  local_778 = "PDB_NAME";
  local_770 = 0x50;
  local_768 = 0x14;
  local_760 = "PDB_OUTPUT_DIRECTORY";
  local_758 = 0x50;
  local_750 = 0x19;
  local_748 = "POSITION_INDEPENDENT_CODE";
  local_740 = 0x50;
  local_738 = 0x13;
  local_730 = "POST_INSTALL_SCRIPT";
  local_728 = 0x50;
  local_720 = 6;
  local_718 = "PREFIX";
  local_710 = 0x50;
  local_708 = 8;
  local_700 = "PROPERTY";
  local_6f8 = 0x50;
  local_6f0 = 0x12;
  local_6e8 = "PRE_INSTALL_SCRIPT";
  local_6e0 = 0x50;
  local_6d8 = 0xe;
  local_6d0 = "PRIVATE_HEADER";
  local_6c8 = 0x50;
  local_6c0 = 0xd;
  local_6b8 = "PROJECT_LABEL";
  local_6b0 = 0x50;
  local_6a8 = 0xd;
  local_6a0 = "PUBLIC_HEADER";
  local_698 = 0x52;
  local_690 = 8;
  local_688 = "RESOURCE";
  local_680 = 0x52;
  local_678 = 0x13;
  local_670 = "RULE_LAUNCH_COMPILE";
  local_668 = 0x52;
  local_660 = 0x12;
  local_658 = "RULE_LAUNCH_CUSTOM";
  local_650 = 0x52;
  local_648 = 0x10;
  local_640 = "RULE_LAUNCH_LINK";
  local_638 = 0x52;
  local_630 = 0x18;
  local_628 = "RUNTIME_OUTPUT_DIRECTORY";
  local_620 = 0x52;
  local_618 = 0x13;
  local_610 = "RUNTIME_OUTPUT_NAME";
  local_608 = 0x53;
  local_600 = 0x10;
  local_5f8 = "SKIP_BUILD_RPATH";
  local_5f0 = 0x53;
  local_5e8 = 7;
  local_5e0 = "SOURCES";
  local_5d8 = 0x53;
  local_5d0 = 9;
  local_5c8 = "SOVERSION";
  local_5c0 = 0x53;
  local_5b8 = 0x14;
  local_5b0 = "STATIC_LIBRARY_FLAGS";
  local_5a8 = 0x53;
  local_5a0 = 6;
  local_598 = "SUFFIX";
  local_590 = 0x54;
  local_588 = 6;
  local_580 = "TARGET";
  local_578 = 0x54;
  local_570 = 4;
  local_568 = "TYPE";
  local_560 = 0x56;
  local_558 = 7;
  local_550 = "VERSION";
  local_548 = 0x56;
  local_540 = 0x19;
  local_538 = "VISIBILITY_INLINES_HIDDEN";
  local_530 = 0x56;
  local_528 = 0x14;
  local_520 = "VS_DOTNET_REFERENCES";
  local_518 = 0x56;
  local_510 = 0x22;
  local_508 = "VS_DOTNET_TARGET_FRAMEWORK_VERSION";
  local_500 = 0x56;
  local_4f8 = 0x11;
  local_4f0 = "VS_GLOBAL_KEYWORD";
  local_4e8 = 0x56;
  local_4e0 = 0x17;
  local_4d8 = "VS_GLOBAL_PROJECT_TYPES";
  local_4d0 = 0x56;
  local_4c8 = 0x17;
  local_4c0 = "VS_GLOBAL_ROOTNAMESPACE";
  local_4b8 = 0x56;
  local_4b0 = 10;
  local_4a8 = "VS_KEYWORD";
  local_4a0 = 0x56;
  local_498 = 0xe;
  local_490 = "VS_SCC_AUXPATH";
  local_488 = 0x56;
  local_480 = 0x10;
  local_478 = "VS_SCC_LOCALPATH";
  local_470 = 0x56;
  local_468 = 0x12;
  local_460 = "VS_SCC_PROJECTNAME";
  local_458 = 0x56;
  local_450 = 0xf;
  local_448 = "VS_SCC_PROVIDER";
  local_440 = 0x56;
  local_438 = 0x13;
  local_430 = "VS_WINRT_EXTENSIONS";
  local_428 = 0x56;
  local_420 = 0x13;
  local_418 = "VS_WINRT_REFERENCES";
  local_410 = 0x57;
  local_408 = 0x10;
  local_400 = "WIN32_EXECUTABLE";
  local_3f8 = 0x41;
  local_3f0 = 0x16;
  local_3e8 = "ATTACHED_FILES_ON_FAIL";
  local_3e0 = 0x41;
  local_3d8 = 0xe;
  local_3d0 = "ATTACHED_FILES";
  local_3c8 = 0x43;
  local_3c0 = 4;
  local_3b8 = "COST";
  local_3b0 = 0x44;
  local_3a8 = 7;
  local_3a0 = "DEPENDS";
  local_398 = 0x45;
  local_390 = 0xb;
  local_388 = "ENVIRONMENT";
  local_380 = 0x46;
  local_378 = 0x17;
  local_370 = "FAIL_REGULAR_EXPRESSION";
  local_368 = 0x4c;
  local_360 = 6;
  local_358 = "LABELS";
  local_350 = 0x4d;
  local_348 = 0xb;
  local_340 = "MEASUREMENT";
  local_338 = 0x50;
  local_330 = 0x17;
  local_328 = "PASS_REGULAR_EXPRESSION";
  local_320 = 0x50;
  local_318 = 10;
  local_310 = "PROCESSORS";
  local_308 = 0x52;
  local_300 = 0xe;
  local_2f8 = "REQUIRED_FILES";
  local_2f0 = 0x52;
  local_2e8 = 0xd;
  local_2e0 = "RESOURCE_LOCK";
  local_2d8 = 0x52;
  local_2d0 = 10;
  local_2c8 = "RUN_SERIAL";
  local_2c0 = 0x53;
  local_2b8 = 0x10;
  local_2b0 = "SKIP_RETURN_CODE";
  local_2a8 = 0x54;
  local_2a0 = 7;
  local_298 = "TIMEOUT";
  local_290 = 0x57;
  local_288 = 9;
  local_280 = "WILL_FAIL";
  local_278 = 0x57;
  local_270 = 0x11;
  local_268 = "WORKING_DIRECTORY";
  local_260 = 0x41;
  local_258 = 8;
  local_250 = "ABSTRACT";
  local_248 = 0x41;
  local_240 = 0xf;
  local_238 = "AUTOUIC_OPTIONS";
  local_230 = 0x41;
  local_228 = 0xf;
  local_220 = "AUTORCC_OPTIONS";
  local_218 = 0x43;
  local_210 = 0x13;
  local_208 = "COMPILE_DEFINITIONS";
  local_200 = 0x43;
  local_1f8 = 0xd;
  local_1f0 = "COMPILE_FLAGS";
  local_1e8 = 0x45;
  local_1e0 = 0xf;
  local_1d8 = "EXTERNAL_OBJECT";
  local_1d0 = 0x46;
  local_1c8 = 0xe;
  local_1c0 = "Fortran_FORMAT";
  local_1b8 = 0x47;
  local_1b0 = 9;
  local_1a8 = "GENERATED";
  local_1a0 = 0x48;
  local_198 = 0x10;
  local_190 = "HEADER_FILE_ONLY";
  local_188 = 0x4b;
  local_180 = 0xe;
  local_178 = "KEEP_EXTENSION";
  local_170 = 0x4c;
  local_168 = 6;
  local_160 = "LABELS";
  local_158 = 0x4c;
  local_150 = 8;
  local_148 = "LOCATION";
  local_140 = 0x4d;
  local_138 = 0x17;
  local_130 = "MACOSX_PACKAGE_LOCATION";
  local_128 = 0x4f;
  local_120 = 0xe;
  local_118 = "OBJECT_DEPENDS";
  local_110 = 0x4f;
  local_108 = 0xe;
  local_100 = "OBJECT_OUTPUTS";
  local_f8 = 0x53;
  local_f0 = 8;
  local_e8 = "SYMBOLIC";
  local_e0 = 0x57;
  local_d8 = 0xc;
  local_d0 = "WRAP_EXCLUDE";
  local_c8 = 0x41;
  local_c0 = 8;
  local_b8 = "ADVANCED";
  local_b0 = 0x48;
  local_a8 = 10;
  local_a0 = "HELPSTRING";
  local_98 = 0x4d;
  local_90 = 8;
  local_88 = "MODIFIED";
  local_80 = 0x53;
  local_78 = 7;
  local_70 = "STRINGS";
  local_68 = 0x54;
  local_60 = 4;
  local_58 = "TYPE";
  local_50 = 0x56;
  local_48 = 5;
  local_40 = "VALUE";
  list_01._M_len = 0xce;
  list_01._M_array = &local_1388;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_1398,list_01);
  QMultiHash<char,_QLatin1String>::operator=(&cmake_builtin,&QStack_1398);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_1398);
  local_1388.first = 'C';
  local_1388.second.m_size = 10;
  local_1388.second.m_data = "CMAKE_ARGC";
  local_1370 = 0x43;
  local_1368 = 0xb;
  local_1360 = "CMAKE_ARGV0";
  local_1358 = 0x43;
  local_1350 = 8;
  local_1348 = "CMAKE_AR";
  local_1340 = 0x43;
  local_1338 = 0x10;
  local_1330 = "CMAKE_BINARY_DIR";
  local_1328 = 0x43;
  local_1320 = 0x10;
  local_1318 = "CMAKE_BUILD_TOOL";
  local_1310 = 0x43;
  local_1308 = 0x13;
  local_1300 = "CMAKE_CACHEFILE_DIR";
  local_12f8 = 0x43;
  local_12f0 = 0x19;
  local_12e8 = "CMAKE_CACHE_MAJOR_VERSION";
  local_12e0 = 0x43;
  local_12d8 = 0x19;
  local_12d0 = "CMAKE_CACHE_MINOR_VERSION";
  local_12c8 = 0x43;
  local_12c0 = 0x19;
  local_12b8 = "CMAKE_CACHE_PATCH_VERSION";
  local_12b0 = 0x43;
  local_12a8 = 0x10;
  local_12a0 = "CMAKE_CFG_INTDIR";
  local_1298 = 0x43;
  local_1290 = 0xd;
  local_1288 = "CMAKE_COMMAND";
  local_1280 = 0x43;
  local_1278 = 0x14;
  local_1270 = "CMAKE_CROSSCOMPILING";
  local_1268 = 0x43;
  local_1260 = 0x13;
  local_1258 = "CMAKE_CTEST_COMMAND";
  local_1250 = 0x43;
  local_1248 = 0x18;
  local_1240 = "CMAKE_CURRENT_BINARY_DIR";
  local_1238 = 0x43;
  local_1230 = 0x16;
  local_1228 = "CMAKE_CURRENT_LIST_DIR";
  local_1220 = 0x43;
  local_1218 = 0x17;
  local_1210 = "CMAKE_CURRENT_LIST_FILE";
  local_1208 = 0x43;
  local_1200 = 0x17;
  local_11f8 = "CMAKE_CURRENT_LIST_LINE";
  local_11f0 = 0x43;
  local_11e8 = 0x18;
  local_11e0 = "CMAKE_CURRENT_SOURCE_DIR";
  local_11d8 = 0x43;
  local_11d0 = 0xd;
  local_11c8 = "CMAKE_DL_LIBS";
  local_11c0 = 0x43;
  local_11b8 = 0x12;
  local_11b0 = "CMAKE_EDIT_COMMAND";
  local_11a8 = 0x43;
  local_11a0 = 0x17;
  local_1198 = "CMAKE_EXECUTABLE_SUFFIX";
  local_1190 = 0x43;
  local_1188 = 0x15;
  local_1180 = "CMAKE_EXTRA_GENERATOR";
  local_1178 = 0x43;
  local_1170 = 0x23;
  local_1168 = "CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES";
  local_1160 = 0x43;
  local_1158 = 0xf;
  local_1150 = "CMAKE_GENERATOR";
  local_1148 = 0x43;
  local_1140 = 0x17;
  local_1138 = "CMAKE_GENERATOR_TOOLSET";
  local_1130 = 0x43;
  local_1128 = 0x14;
  local_1120 = "CMAKE_HOME_DIRECTORY";
  local_1118 = 0x43;
  local_1110 = 0x1b;
  local_1108 = "CMAKE_IMPORT_LIBRARY_PREFIX";
  local_1100 = 0x43;
  local_10f8 = 0x1b;
  local_10f0 = "CMAKE_IMPORT_LIBRARY_SUFFIX";
  local_10e8 = 0x43;
  local_10e0 = 0x16;
  local_10d8 = "CMAKE_JOB_POOL_COMPILE";
  local_10d0 = 0x43;
  local_10c8 = 0x13;
  local_10c0 = "CMAKE_JOB_POOL_LINK";
  local_10b8 = 0x43;
  local_10b0 = 0x19;
  local_10a8 = "CMAKE_LINK_LIBRARY_SUFFIX";
  local_10a0 = 0x43;
  local_1098 = 0x13;
  local_1090 = "CMAKE_MAJOR_VERSION";
  local_1088 = 0x43;
  local_1080 = 0x12;
  local_1078 = "CMAKE_MAKE_PROGRAM";
  local_1070 = 0x43;
  local_1068 = 0x1e;
  local_1060 = "CMAKE_MINIMUM_REQUIRED_VERSION";
  local_1058 = 0x43;
  local_1050 = 0x13;
  local_1048 = "CMAKE_MINOR_VERSION";
  local_1040 = 0x43;
  local_1038 = 0x16;
  local_1030 = "CMAKE_PARENT_LIST_FILE";
  local_1028 = 0x43;
  local_1020 = 0x13;
  local_1018 = "CMAKE_PATCH_VERSION";
  local_1010 = 0x43;
  local_1008 = 0x12;
  local_1000 = "CMAKE_PROJECT_NAME";
  local_ff8 = 0x43;
  local_ff0 = 0xc;
  local_fe8 = "CMAKE_RANLIB";
  local_fe0 = 0x43;
  local_fd8 = 10;
  local_fd0 = "CMAKE_ROOT";
  local_fc8 = 0x43;
  local_fc0 = 0x16;
  local_fb8 = "CMAKE_SCRIPT_MODE_FILE";
  local_fb0 = 0x43;
  local_fa8 = 0x1b;
  local_fa0 = "CMAKE_SHARED_LIBRARY_PREFIX";
  local_f98 = 0x43;
  local_f90 = 0x1b;
  local_f88 = "CMAKE_SHARED_LIBRARY_SUFFIX";
  local_f80 = 0x43;
  local_f78 = 0x1a;
  local_f70 = "CMAKE_SHARED_MODULE_PREFIX";
  local_f68 = 0x43;
  local_f60 = 0x1a;
  local_f58 = "CMAKE_SHARED_MODULE_SUFFIX";
  local_f50 = 0x43;
  local_f48 = 0x13;
  local_f40 = "CMAKE_SIZEOF_VOID_P";
  local_f38 = 0x43;
  local_f30 = 0x18;
  local_f28 = "CMAKE_SKIP_INSTALL_RULES";
  local_f20 = 0x43;
  local_f18 = 0x10;
  local_f10 = "CMAKE_SKIP_RPATH";
  local_f08 = 0x43;
  local_f00 = 0x10;
  local_ef8 = "CMAKE_SOURCE_DIR";
  local_ef0 = 0x43;
  local_ee8 = 0x18;
  local_ee0 = "CMAKE_STANDARD_LIBRARIES";
  local_ed8 = 0x43;
  local_ed0 = 0x1b;
  local_ec8 = "CMAKE_STATIC_LIBRARY_PREFIX";
  local_ec0 = 0x43;
  local_eb8 = 0x1b;
  local_eb0 = "CMAKE_STATIC_LIBRARY_SUFFIX";
  local_ea8 = 0x43;
  local_ea0 = 0x14;
  local_e98 = "CMAKE_TOOLCHAIN_FILE";
  local_e90 = 0x43;
  local_e88 = 0x13;
  local_e80 = "CMAKE_TWEAK_VERSION";
  local_e78 = 0x43;
  local_e70 = 0x16;
  local_e68 = "CMAKE_VERBOSE_MAKEFILE";
  local_e60 = 0x43;
  local_e58 = 0xd;
  local_e50 = "CMAKE_VERSION";
  local_e48 = 0x43;
  local_e40 = 0x17;
  local_e38 = "CMAKE_VS_DEVENV_COMMAND";
  local_e30 = 0x43;
  local_e28 = 0x26;
  local_e20 = "CMAKE_VS_INTEL_Fortran_PROJECT_VERSION";
  local_e18 = 0x43;
  local_e10 = 0x18;
  local_e08 = "CMAKE_VS_MSBUILD_COMMAND";
  local_e00 = 0x43;
  local_df8 = 0x16;
  local_df0 = "CMAKE_VS_MSDEV_COMMAND";
  local_de8 = 0x43;
  local_de0 = 0x19;
  local_dd8 = "CMAKE_VS_PLATFORM_TOOLSET";
  local_dd0 = 0x43;
  local_dc8 = 0x1c;
  local_dc0 = "CMAKE_XCODE_PLATFORM_TOOLSET";
  local_db8 = 0x50;
  local_db0 = 0x12;
  local_da8 = "PROJECT_BINARY_DIR";
  local_da0 = 0x50;
  local_d98 = 0x12;
  local_d90 = "PROJECT_SOURCE_DIR";
  local_d88 = 0x50;
  local_d80 = 0xf;
  local_d78 = "PROJECT_VERSION";
  local_d70 = 0x50;
  local_d68 = 0x15;
  local_d60 = "PROJECT_VERSION_MAJOR";
  local_d58 = 0x50;
  local_d50 = 0x15;
  local_d48 = "PROJECT_VERSION_MINOR";
  local_d40 = 0x50;
  local_d38 = 0x15;
  local_d30 = "PROJECT_VERSION_PATCH";
  local_d28 = 0x50;
  local_d20 = 0x15;
  local_d18 = "PROJECT_VERSION_TWEAK";
  local_d10 = 0x42;
  local_d08 = 0x11;
  local_d00 = "BUILD_SHARED_LIBS";
  local_cf8 = 0x43;
  local_cf0 = 0x20;
  local_ce8 = "CMAKE_ABSOLUTE_DESTINATION_FILES";
  local_ce0 = 0x43;
  local_cd8 = 0x14;
  local_cd0 = "CMAKE_APPBUNDLE_PATH";
  local_cc8 = 0x43;
  local_cc0 = 0x1a;
  local_cb8 = "CMAKE_AUTOMOC_RELAXED_MODE";
  local_cb0 = 0x43;
  local_ca8 = 0x1d;
  local_ca0 = "CMAKE_BACKWARDS_COMPATIBILITY";
  local_c98 = 0x43;
  local_c90 = 0x10;
  local_c88 = "CMAKE_BUILD_TYPE";
  local_c80 = 0x43;
  local_c78 = 0x14;
  local_c70 = "CMAKE_COLOR_MAKEFILE";
  local_c68 = 0x43;
  local_c60 = 0x19;
  local_c58 = "CMAKE_CONFIGURATION_TYPES";
  local_c50 = 0x43;
  local_c48 = 0x1d;
  local_c40 = "CMAKE_DEBUG_TARGET_PROPERTIES";
  local_c38 = 0x43;
  local_c30 = 0x16;
  local_c28 = "CMAKE_ERROR_DEPRECATED";
  local_c20 = 0x43;
  local_c18 = 0x2b;
  local_c10 = "CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION";
  local_c08 = 0x43;
  local_c00 = 0xd;
  local_bf8 = "CMAKE_SYSROOT";
  local_bf0 = 0x43;
  local_be8 = 0x1b;
  local_be0 = "CMAKE_FIND_LIBRARY_PREFIXES";
  local_bd8 = 0x43;
  local_bd0 = 0x1b;
  local_bc8 = "CMAKE_FIND_LIBRARY_SUFFIXES";
  local_bc0 = 0x43;
  local_bb8 = 0x1c;
  local_bb0 = "CMAKE_FIND_NO_INSTALL_PREFIX";
  local_ba8 = 0x43;
  local_ba0 = 0x21;
  local_b98 = "CMAKE_FIND_PACKAGE_WARN_NO_MODULE";
  local_b90 = 0x43;
  local_b88 = 0x14;
  local_b80 = "CMAKE_FIND_ROOT_PATH";
  local_b78 = 0x43;
  local_b70 = 0x21;
  local_b68 = "CMAKE_FIND_ROOT_PATH_MODE_INCLUDE";
  local_b60 = 0x43;
  local_b58 = 0x21;
  local_b50 = "CMAKE_FIND_ROOT_PATH_MODE_LIBRARY";
  local_b48 = 0x43;
  local_b40 = 0x21;
  local_b38 = "CMAKE_FIND_ROOT_PATH_MODE_PACKAGE";
  local_b30 = 0x43;
  local_b28 = 0x21;
  local_b20 = "CMAKE_FIND_ROOT_PATH_MODE_PROGRAM";
  local_b18 = 0x43;
  local_b10 = 0x14;
  local_b08 = "CMAKE_FRAMEWORK_PATH";
  local_b00 = 0x43;
  local_af8 = 0x11;
  local_af0 = "CMAKE_IGNORE_PATH";
  local_ae8 = 0x43;
  local_ae0 = 0x12;
  local_ad8 = "CMAKE_INCLUDE_PATH";
  local_ad0 = 0x43;
  local_ac8 = 0x20;
  local_ac0 = "CMAKE_INCLUDE_DIRECTORIES_BEFORE";
  local_ab8 = 0x43;
  local_ab0 = 0x28;
  local_aa8 = "CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE";
  local_aa0 = 0x43;
  local_a98 = 0x24;
  local_a90 = "CMAKE_INSTALL_DEFAULT_COMPONENT_NAME";
  local_a88 = 0x43;
  local_a80 = 0x14;
  local_a78 = "CMAKE_INSTALL_PREFIX";
  local_a70 = 0x43;
  local_a68 = 0x12;
  local_a60 = "CMAKE_LIBRARY_PATH";
  local_a58 = 0x43;
  local_a50 = 0xe;
  local_a48 = "CMAKE_MFC_FLAG";
  local_a40 = 0x43;
  local_a38 = 0x11;
  local_a30 = "CMAKE_MODULE_PATH";
  local_a28 = 0x43;
  local_a20 = 0x1c;
  local_a18 = "CMAKE_NOT_USING_CONFIG_FLAGS";
  local_a10 = 0x43;
  local_a08 = 0x11;
  local_a00 = "CMAKE_PREFIX_PATH";
  local_9f8 = 0x43;
  local_9f0 = 0x12;
  local_9e8 = "CMAKE_PROGRAM_PATH";
  local_9e0 = 0x43;
  local_9d8 = 0x21;
  local_9d0 = "CMAKE_SKIP_INSTALL_ALL_DEPENDENCY";
  local_9c8 = 0x43;
  local_9c0 = 0x14;
  local_9b8 = "CMAKE_STAGING_PREFIX";
  local_9b0 = 0x43;
  local_9a8 = 0x18;
  local_9a0 = "CMAKE_SYSTEM_IGNORE_PATH";
  local_998 = 0x43;
  local_990 = 0x19;
  local_988 = "CMAKE_SYSTEM_INCLUDE_PATH";
  local_980 = 0x43;
  local_978 = 0x19;
  local_970 = "CMAKE_SYSTEM_LIBRARY_PATH";
  local_968 = 0x43;
  local_960 = 0x18;
  local_958 = "CMAKE_SYSTEM_PREFIX_PATH";
  local_950 = 0x43;
  local_948 = 0x19;
  local_940 = "CMAKE_SYSTEM_PROGRAM_PATH";
  local_938 = 0x43;
  local_930 = 0x1e;
  local_928 = "CMAKE_USER_MAKE_RULES_OVERRIDE";
  local_920 = 0x43;
  local_918 = 0x15;
  local_910 = "CMAKE_WARN_DEPRECATED";
  local_908 = 0x43;
  local_900 = 0x2a;
  local_8f8 = "CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION";
  local_8f0 = 0x41;
  local_8e8 = 5;
  local_8e0 = "APPLE";
  local_8d8 = 0x42;
  local_8d0 = 7;
  local_8c8 = "BORLAND";
  local_8c0 = 0x43;
  local_8b8 = 0xb;
  local_8b0 = "CMAKE_CL_64";
  local_8a8 = 0x43;
  local_8a0 = 0x13;
  local_898 = "CMAKE_COMPILER_2005";
  local_890 = 0x43;
  local_888 = 0x10;
  local_880 = "CMAKE_HOST_APPLE";
  local_878 = 0x43;
  local_870 = 0x16;
  local_868 = "CMAKE_HOST_SYSTEM_NAME";
  local_860 = 0x43;
  local_858 = 0x1b;
  local_850 = "CMAKE_HOST_SYSTEM_PROCESSOR";
  local_848 = 0x43;
  local_840 = 0x11;
  local_838 = "CMAKE_HOST_SYSTEM";
  local_830 = 0x43;
  local_828 = 0x19;
  local_820 = "CMAKE_HOST_SYSTEM_VERSION";
  local_818 = 0x43;
  local_810 = 0xf;
  local_808 = "CMAKE_HOST_UNIX";
  local_800 = 0x43;
  local_7f8 = 0x10;
  local_7f0 = "CMAKE_HOST_WIN32";
  local_7e8 = 0x43;
  local_7e0 = 0x20;
  local_7d8 = "CMAKE_LIBRARY_ARCHITECTURE_REGEX";
  local_7d0 = 0x43;
  local_7c8 = 0x1a;
  local_7c0 = "CMAKE_LIBRARY_ARCHITECTURE";
  local_7b8 = 0x43;
  local_7b0 = 0x15;
  local_7a8 = "CMAKE_OBJECT_PATH_MAX";
  local_7a0 = 0x43;
  local_798 = 0x11;
  local_790 = "CMAKE_SYSTEM_NAME";
  local_788 = 0x43;
  local_780 = 0x16;
  local_778 = "CMAKE_SYSTEM_PROCESSOR";
  local_770 = 0x43;
  local_768 = 0xc;
  local_760 = "CMAKE_SYSTEM";
  local_758 = 0x43;
  local_750 = 0x14;
  local_748 = "CMAKE_SYSTEM_VERSION";
  local_740 = 0x43;
  local_738 = 6;
  local_730 = "CYGWIN";
  local_728 = 0x45;
  local_720 = 3;
  local_718 = "ENV";
  local_710 = 0x4d;
  local_708 = 6;
  local_700 = "MSVC10";
  local_6f8 = 0x4d;
  local_6f0 = 6;
  local_6e8 = "MSVC11";
  local_6e0 = 0x4d;
  local_6d8 = 6;
  local_6d0 = "MSVC12";
  local_6c8 = 0x4d;
  local_6c0 = 6;
  local_6b8 = "MSVC60";
  local_6b0 = 0x4d;
  local_6a8 = 6;
  local_6a0 = "MSVC70";
  local_698 = 0x4d;
  local_690 = 6;
  local_688 = "MSVC71";
  local_680 = 0x4d;
  local_678 = 6;
  local_670 = "MSVC80";
  local_668 = 0x4d;
  local_660 = 6;
  local_658 = "MSVC90";
  local_650 = 0x4d;
  local_648 = 8;
  local_640 = "MSVC_IDE";
  local_638 = 0x4d;
  local_630 = 4;
  local_628 = "MSVC";
  local_620 = 0x4d;
  local_618 = 0xc;
  local_610 = "MSVC_VERSION";
  local_608 = 0x55;
  local_600 = 4;
  local_5f8 = "UNIX";
  local_5f0 = 0x57;
  local_5e8 = 5;
  local_5e0 = "WIN32";
  local_5d8 = 0x58;
  local_5d0 = 0xd;
  local_5c8 = "XCODE_VERSION";
  local_5c0 = 0x43;
  local_5b8 = 0x1e;
  local_5b0 = "CMAKE_ARCHIVE_OUTPUT_DIRECTORY";
  local_5a8 = 0x43;
  local_5a0 = 0x19;
  local_598 = "CMAKE_AUTOMOC_MOC_OPTIONS";
  local_590 = 0x43;
  local_588 = 0xd;
  local_580 = "CMAKE_AUTOMOC";
  local_578 = 0x43;
  local_570 = 0xd;
  local_568 = "CMAKE_AUTORCC";
  local_560 = 0x43;
  local_558 = 0x15;
  local_550 = "CMAKE_AUTORCC_OPTIONS";
  local_548 = 0x43;
  local_540 = 0xd;
  local_538 = "CMAKE_AUTOUIC";
  local_530 = 0x43;
  local_528 = 0x15;
  local_520 = "CMAKE_AUTOUIC_OPTIONS";
  local_518 = 0x43;
  local_510 = 0x1e;
  local_508 = "CMAKE_BUILD_WITH_INSTALL_RPATH";
  local_500 = 0x43;
  local_4f8 = 0x13;
  local_4f0 = "CMAKE_DEBUG_POSTFIX";
  local_4e8 = 0x43;
  local_4e0 = 0x16;
  local_4d8 = "CMAKE_EXE_LINKER_FLAGS";
  local_4d0 = 0x43;
  local_4c8 = 0x14;
  local_4c0 = "CMAKE_Fortran_FORMAT";
  local_4b8 = 0x43;
  local_4b0 = 0x1e;
  local_4a8 = "CMAKE_Fortran_MODULE_DIRECTORY";
  local_4a0 = 0x43;
  local_498 = 0xd;
  local_490 = "CMAKE_GNUtoMS";
  local_488 = 0x43;
  local_480 = 0x26;
  local_478 = "CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE";
  local_470 = 0x43;
  local_468 = 0x19;
  local_460 = "CMAKE_INCLUDE_CURRENT_DIR";
  local_458 = 0x43;
  local_450 = 0x16;
  local_448 = "CMAKE_INSTALL_NAME_DIR";
  local_440 = 0x43;
  local_438 = 0x13;
  local_430 = "CMAKE_INSTALL_RPATH";
  local_428 = 0x43;
  local_420 = 0x21;
  local_418 = "CMAKE_INSTALL_RPATH_USE_LINK_PATH";
  local_410 = 0x43;
  local_408 = 0x1e;
  local_400 = "CMAKE_LIBRARY_OUTPUT_DIRECTORY";
  local_3f8 = 0x43;
  local_3f0 = 0x17;
  local_3e8 = "CMAKE_LIBRARY_PATH_FLAG";
  local_3e0 = 0x43;
  local_3d8 = 0x18;
  local_3d0 = "CMAKE_LINK_DEF_FILE_FLAG";
  local_3c8 = 0x43;
  local_3c0 = 0x1c;
  local_3b8 = "CMAKE_LINK_DEPENDS_NO_SHARED";
  local_3b0 = 0x43;
  local_3a8 = 0x1e;
  local_3a0 = "CMAKE_LINK_INTERFACE_LIBRARIES";
  local_398 = 0x43;
  local_390 = 0x1c;
  local_388 = "CMAKE_LINK_LIBRARY_FILE_FLAG";
  local_380 = 0x43;
  local_378 = 0x17;
  local_370 = "CMAKE_LINK_LIBRARY_FLAG";
  local_368 = 0x43;
  local_360 = 0x13;
  local_358 = "CMAKE_MACOSX_BUNDLE";
  local_350 = 0x43;
  local_348 = 0x12;
  local_340 = "CMAKE_MACOSX_RPATH";
  local_338 = 0x43;
  local_330 = 0x19;
  local_328 = "CMAKE_MODULE_LINKER_FLAGS";
  local_320 = 0x43;
  local_318 = 0x18;
  local_310 = "CMAKE_NO_BUILTIN_CHRPATH";
  local_308 = 0x43;
  local_300 = 0x1d;
  local_2f8 = "CMAKE_NO_SYSTEM_FROM_IMPORTED";
  local_2f0 = 0x43;
  local_2e8 = 0x17;
  local_2e0 = "CMAKE_OSX_ARCHITECTURES";
  local_2d8 = 0x43;
  local_2d0 = 0x1b;
  local_2c8 = "CMAKE_OSX_DEPLOYMENT_TARGET";
  local_2c0 = 0x43;
  local_2b8 = 0x11;
  local_2b0 = "CMAKE_OSX_SYSROOT";
  local_2a8 = 0x43;
  local_2a0 = 0x1a;
  local_298 = "CMAKE_PDB_OUTPUT_DIRECTORY";
  local_290 = 0x43;
  local_288 = 0x1f;
  local_280 = "CMAKE_POSITION_INDEPENDENT_CODE";
  local_278 = 0x43;
  local_270 = 0x1e;
  local_268 = "CMAKE_RUNTIME_OUTPUT_DIRECTORY";
  local_260 = 0x43;
  local_258 = 0x19;
  local_250 = "CMAKE_SHARED_LINKER_FLAGS";
  local_248 = 0x43;
  local_240 = 0x16;
  local_238 = "CMAKE_SKIP_BUILD_RPATH";
  local_230 = 0x43;
  local_228 = 0x18;
  local_220 = "CMAKE_SKIP_INSTALL_RPATH";
  local_218 = 0x43;
  local_210 = 0x19;
  local_208 = "CMAKE_STATIC_LINKER_FLAGS";
  local_200 = 0x43;
  local_1f8 = 0x1f;
  local_1f0 = "CMAKE_TRY_COMPILE_CONFIGURATION";
  local_1e8 = 0x43;
  local_1e0 = 0x18;
  local_1d8 = "CMAKE_USE_RELATIVE_PATHS";
  local_1d0 = 0x43;
  local_1c8 = 0x1f;
  local_1c0 = "CMAKE_VISIBILITY_INLINES_HIDDEN";
  local_1b8 = 0x43;
  local_1b0 = 0x16;
  local_1a8 = "CMAKE_WIN32_EXECUTABLE";
  local_1a0 = 0x45;
  local_198 = 0x16;
  local_190 = "EXECUTABLE_OUTPUT_PATH";
  local_188 = 0x4c;
  local_180 = 0x13;
  local_178 = "LIBRARY_OUTPUT_PATH";
  local_170 = 0x43;
  local_168 = 0x1c;
  local_160 = "CMAKE_Fortran_MODDIR_DEFAULT";
  local_158 = 0x43;
  local_150 = 0x19;
  local_148 = "CMAKE_Fortran_MODDIR_FLAG";
  local_140 = 0x43;
  local_138 = 0x19;
  local_130 = "CMAKE_Fortran_MODOUT_FLAG";
  local_128 = 0x43;
  local_120 = 0x1b;
  local_118 = "CMAKE_INTERNAL_PLATFORM_ABI";
  local_110 = 0x43;
  local_108 = 0x20;
  local_100 = "CPACK_ABSOLUTE_DESTINATION_FILES";
  local_f8 = 0x43;
  local_f0 = 0x2a;
  local_e8 = "CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY";
  local_e0 = 0x43;
  local_d8 = 0x2b;
  local_d0 = "CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION";
  local_c8 = 0x43;
  local_c0 = 0x20;
  local_b8 = "CPACK_INCLUDE_TOPLEVEL_DIRECTORY";
  local_b0 = 0x43;
  local_a8 = 0x14;
  local_a0 = "CPACK_INSTALL_SCRIPT";
  local_98 = 0x43;
  local_90 = 0x1e;
  local_88 = "CPACK_PACKAGING_INSTALL_PREFIX";
  local_80 = 0x43;
  local_78 = 0x11;
  local_70 = "CPACK_SET_DESTDIR";
  local_68 = 0x43;
  local_60 = 0x2a;
  local_58 = "CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION";
  list_02._M_len = 0xcd;
  list_02._M_array = &local_1388;
  QMultiHash<char,_QLatin1String>::QMultiHash(&QStack_1398,list_02);
  QMultiHash<char,_QLatin1String>::operator=(&cmake_other,&QStack_1398);
  QMultiHash<char,_QLatin1String>::~QMultiHash(&QStack_1398);
  return;
}

Assistant:

void initCMakeData() {
    cmake_keywords = {{'b', QLatin1String("break")},
                      {'c', QLatin1String("cmake_host_system_information")},
                      {'c', QLatin1String("cmake_minimum_required")},
                      {'c', QLatin1String("cmake_parse_arguments")},
                      {'c', QLatin1String("cmake_policy")},
                      {'c', QLatin1String("configure_file")},
                      {'c', QLatin1String("continue")},
                      {'e', QLatin1String("elseif")},
                      {'e', QLatin1String("else")},
                      {'e', QLatin1String("endforeach")},
                      {'e', QLatin1String("endfunction")},
                      {'e', QLatin1String("endif")},
                      {'e', QLatin1String("endmacro")},
                      {'e', QLatin1String("endwhile")},
                      {'e', QLatin1String("execute_process")},
                      {'f', QLatin1String("file")},
                      {'f', QLatin1String("find_file")},
                      {'f', QLatin1String("find_library")},
                      {'f', QLatin1String("find_package")},
                      {'f', QLatin1String("find_path")},
                      {'f', QLatin1String("find_program")},
                      {'f', QLatin1String("foreach")},
                      {'f', QLatin1String("function")},
                      {'g', QLatin1String("get_cmake_property")},
                      {'g', QLatin1String("get_directory_property")},
                      {'g', QLatin1String("get_filename_component")},
                      {'g', QLatin1String("get_property")},
                      {'i', QLatin1String("if")},
                      {'i', QLatin1String("include")},
                      {'i', QLatin1String("include_guard")},
                      {'l', QLatin1String("list")},
                      {'m', QLatin1String("macro")},
                      {'m', QLatin1String("mark_as_advanced")},
                      {'m', QLatin1String("math")},
                      {'m', QLatin1String("message")},
                      {'o', QLatin1String("option")},
                      {'r', QLatin1String("return")},
                      {'s', QLatin1String("separate_arguments")},
                      {'s', QLatin1String("set_directory_properties")},
                      {'s', QLatin1String("set")},
                      {'s', QLatin1String("set_property")},
                      {'s', QLatin1String("site_name")},
                      {'s', QLatin1String("string")},
                      {'u', QLatin1String("unset")},
                      {'v', QLatin1String("variable_watch")},
                      {'w', QLatin1String("while")},
                      {'a', QLatin1String("add_compile_definitions")},
                      {'a', QLatin1String("add_compile_options")},
                      {'A', QLatin1String("ADD_COMPILE_OPTIONS")},
                      {'a', QLatin1String("add_custom_command")},
                      {'a', QLatin1String("add_custom_target")},
                      {'a', QLatin1String("add_definitions")},
                      {'a', QLatin1String("add_dependencies")},
                      {'a', QLatin1String("add_executable")},
                      {'a', QLatin1String("add_library")},
                      {'a', QLatin1String("add_link_options")},
                      {'a', QLatin1String("add_subdirectory")},
                      {'a', QLatin1String("add_test")},
                      {'a', QLatin1String("aux_source_directory")},
                      {'b', QLatin1String("build_command")},
                      {'c', QLatin1String("create_test_sourcelist")},
                      {'d', QLatin1String("define_property")},
                      {'e', QLatin1String("enable_language")},
                      {'e', QLatin1String("enable_testing")},
                      {'e', QLatin1String("export")},
                      {'f', QLatin1String("fltk_wrap_ui")},
                      {'g', QLatin1String("get_source_file_property")},
                      {'g', QLatin1String("get_target_property")},
                      {'g', QLatin1String("get_test_property")},
                      {'i', QLatin1String("include_directories")},
                      {'i', QLatin1String("include_external_msproject")},
                      {'i', QLatin1String("include_regular_expression")},
                      {'i', QLatin1String("install")},
                      {'l', QLatin1String("link_directories")},
                      {'l', QLatin1String("link_libraries")},
                      {'l', QLatin1String("load_cache")},
                      {'p', QLatin1String("project")},
                      {'q', QLatin1String("qt_wrap_cpp")},
                      {'q', QLatin1String("qt_wrap_ui")},
                      {'r', QLatin1String("remove_definitions")},
                      {'s', QLatin1String("set_source_files_properties")},
                      {'s', QLatin1String("set_target_properties")},
                      {'s', QLatin1String("set_tests_properties")},
                      {'s', QLatin1String("source_group")},
                      {'t', QLatin1String("target_compile_definitions")},
                      {'t', QLatin1String("target_compile_features")},
                      {'t', QLatin1String("target_compile_options")},
                      {'t', QLatin1String("target_include_directories")},
                      {'t', QLatin1String("target_link_directories")},
                      {'t', QLatin1String("target_link_libraries")},
                      {'t', QLatin1String("target_link_options")},
                      {'t', QLatin1String("target_sources")},
                      {'t', QLatin1String("try_compile")},
                      {'t', QLatin1String("try_run")},
                      {'c', QLatin1String("ctest_build")},
                      {'c', QLatin1String("ctest_configure")},
                      {'c', QLatin1String("ctest_coverage")},
                      {'c', QLatin1String("ctest_empty_binary_directory")},
                      {'c', QLatin1String("ctest_memcheck")},
                      {'c', QLatin1String("ctest_read_custom_files")},
                      {'c', QLatin1String("ctest_run_script")},
                      {'c', QLatin1String("ctest_sleep")},
                      {'c', QLatin1String("ctest_start")},
                      {'c', QLatin1String("ctest_submit")},
                      {'c', QLatin1String("ctest_test")},
                      {'c', QLatin1String("ctest_update")},
                      {'c', QLatin1String("ctest_upload")},
                      {'b', QLatin1String("build_name")},
                      {'e', QLatin1String("exec_program")},
                      {'e', QLatin1String("export_library_dependencies")},
                      {'i', QLatin1String("install_files")},
                      {'i', QLatin1String("install_programs")},
                      {'i', QLatin1String("install_targets")},
                      {'l', QLatin1String("load_command")},
                      {'m', QLatin1String("make_directory")},
                      {'o', QLatin1String("output_required_files")},
                      {'r', QLatin1String("remove")},
                      {'s', QLatin1String("subdir_depends")},
                      {'s', QLatin1String("subdirs")},
                      {'u', QLatin1String("use_mangled_mesa")},
                      {'u', QLatin1String("utility_source")},
                      {'v', QLatin1String("variable_requires")},
                      {'w', QLatin1String("write_file")},
                      {'q', QLatin1String("qt5_use_modules")},
                      {'q', QLatin1String("qt5_use_package")},
                      {'q', QLatin1String("qt5_wrap_cpp")},
                      {'a', QLatin1String("and")},
                      {'o', QLatin1String("or")},
                      {'n', QLatin1String("not")},
                      {'c', QLatin1String("command")},
                      {'p', QLatin1String("policy")},
                      {'t', QLatin1String("target")},
                      {'t', QLatin1String("test")},
                      {'e', QLatin1String("exists")},
                      {'i', QLatin1String("is_newer_than")},
                      {'i', QLatin1String("is_directory")},
                      {'i', QLatin1String("is_symlink")},
                      {'i', QLatin1String("is_absolute")},
                      {'m', QLatin1String("matches")},
                      {'l', QLatin1String("less")},
                      {'g', QLatin1String("greater")},
                      {'e', QLatin1String("equal")},
                      {'l', QLatin1String("less_equal")},
                      {'g', QLatin1String("greater_equal")},
                      {'s', QLatin1String("strless")},
                      {'s', QLatin1String("strgreater")},
                      {'s', QLatin1String("strequal")},
                      {'s', QLatin1String("strless_equal")},
                      {'s', QLatin1String("strgreater_equal")},
                      {'v', QLatin1String("version_less")},
                      {'v', QLatin1String("version_greater")},
                      {'v', QLatin1String("version_equal")},
                      {'v', QLatin1String("version_less_equal")},
                      {'v', QLatin1String("version_greater_equal")},
                      {'i', QLatin1String("in_list")},
                      {'d', QLatin1String("defined")}};
    cmake_types = {};
    cmake_literals = {
        {'o', QLatin1String("on")},   {'o', QLatin1String("off")},
        {'O', QLatin1String("ON")},   {'O', QLatin1String("OFF")},
        {'t', QLatin1String("true")}, {'f', QLatin1String("false")},
        {'T', QLatin1String("TRUE")}, {'F', QLatin1String("FALSE")}};
    cmake_builtin = {
        {'A', QLatin1String("ALLOW_DUPLICATE_CUSTOM_TARGETS")},
        {'A', QLatin1String("AUTOGEN_TARGETS_FOLDER")},
        {'A', QLatin1String("AUTOMOC_TARGETS_FOLDER")},
        {'D', QLatin1String("DEBUG_CONFIGURATIONS")},
        {'D', QLatin1String("DISABLED_FEATURES")},
        {'E', QLatin1String("ENABLED_FEATURES")},
        {'E', QLatin1String("ENABLED_LANGUAGES")},
        {'F', QLatin1String("FIND_LIBRARY_USE_LIB64_PATHS")},
        {'F', QLatin1String("FIND_LIBRARY_USE_OPENBSD_VERSIONING")},
        {'G', QLatin1String("GLOBAL_DEPENDS_DEBUG_MODE")},
        {'G', QLatin1String("GLOBAL_DEPENDS_NO_CYCLES")},
        {'I', QLatin1String("IN_TRY_COMPILE")},
        {'P', QLatin1String("PACKAGES_FOUND")},
        {'P', QLatin1String("PACKAGES_NOT_FOUND")},
        {'J', QLatin1String("JOB_POOLS")},
        {'P', QLatin1String("PREDEFINED_TARGETS_FOLDER")},
        {'E', QLatin1String("ECLIPSE_EXTRA_NATURES")},
        {'R', QLatin1String("REPORT_UNDEFINED_PROPERTIES")},
        {'R', QLatin1String("RULE_LAUNCH_COMPILE")},
        {'R', QLatin1String("RULE_LAUNCH_CUSTOM")},
        {'R', QLatin1String("RULE_LAUNCH_LINK")},
        {'R', QLatin1String("RULE_MESSAGES")},
        {'T', QLatin1String("TARGET_ARCHIVES_MAY_BE_SHARED_LIBS")},
        {'T', QLatin1String("TARGET_SUPPORTS_SHARED_LIBS")},
        {'U', QLatin1String("USE_FOLDERS")},
        {'A', QLatin1String("ADDITIONAL_MAKE_CLEAN_FILES")},
        {'C', QLatin1String("CACHE_VARIABLES")},
        {'C', QLatin1String("CLEAN_NO_CUSTOM")},
        {'C', QLatin1String("CMAKE_CONFIGURE_DEPENDS")},
        {'C', QLatin1String("COMPILE_DEFINITIONS")},
        {'C', QLatin1String("COMPILE_OPTIONS")},
        {'D', QLatin1String("DEFINITIONS")},
        {'E', QLatin1String("EXCLUDE_FROM_ALL")},
        {'I', QLatin1String("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")},
        {'I', QLatin1String("INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INCLUDE_REGULAR_EXPRESSION")},
        {'I', QLatin1String("INTERPROCEDURAL_OPTIMIZATION")},
        {'L', QLatin1String("LINK_DIRECTORIES")},
        {'L', QLatin1String("LISTFILE_STACK")},
        {'M', QLatin1String("MACROS")},
        {'P', QLatin1String("PARENT_DIRECTORY")},
        {'R', QLatin1String("RULE_LAUNCH_COMPILE")},
        {'R', QLatin1String("RULE_LAUNCH_CUSTOM")},
        {'R', QLatin1String("RULE_LAUNCH_LINK")},
        {'T', QLatin1String("TEST_INCLUDE_FILE")},
        {'V', QLatin1String("VARIABLES")},
        {'A', QLatin1String("ALIASED_TARGET")},
        {'A', QLatin1String("ARCHIVE_OUTPUT_DIRECTORY")},
        {'A', QLatin1String("ARCHIVE_OUTPUT_NAME")},
        {'A', QLatin1String("AUTOGEN_TARGET_DEPENDS")},
        {'A', QLatin1String("AUTOMOC_MOC_OPTIONS")},
        {'A', QLatin1String("AUTOMOC")},
        {'A', QLatin1String("AUTOUIC")},
        {'A', QLatin1String("AUTOUIC_OPTIONS")},
        {'A', QLatin1String("AUTORCC")},
        {'A', QLatin1String("AUTORCC_OPTIONS")},
        {'B', QLatin1String("BUILD_WITH_INSTALL_RPATH")},
        {'B', QLatin1String("BUNDLE_EXTENSION")},
        {'B', QLatin1String("BUNDLE")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_BOOL")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_NUMBER_MAX")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_NUMBER_MIN")},
        {'C', QLatin1String("COMPATIBLE_INTERFACE_STRING")},
        {'C', QLatin1String("COMPILE_DEFINITIONS")},
        {'C', QLatin1String("COMPILE_FLAGS")},
        {'C', QLatin1String("COMPILE_OPTIONS")},
        {'D', QLatin1String("DEBUG_POSTFIX")},
        {'D', QLatin1String("DEFINE_SYMBOL")},
        {'E', QLatin1String("EchoString")},
        {'E', QLatin1String("ENABLE_EXPORTS")},
        {'E', QLatin1String("EXCLUDE_FROM_ALL")},
        {'E', QLatin1String("EXCLUDE_FROM_DEFAULT_BUILD")},
        {'E', QLatin1String("EXPORT_NAME")},
        {'F', QLatin1String("FOLDER")},
        {'F', QLatin1String("Fortran_FORMAT")},
        {'F', QLatin1String("Fortran_MODULE_DIRECTORY")},
        {'F', QLatin1String("FRAMEWORK")},
        {'G', QLatin1String("GENERATOR_FILE_NAME")},
        {'G', QLatin1String("GNUtoMS")},
        {'H', QLatin1String("HAS_CXX")},
        {'I', QLatin1String("IMPLICIT_DEPENDS_INCLUDE_TRANSFORM")},
        {'I', QLatin1String("IMPORTED_CONFIGURATIONS")},
        {'I', QLatin1String("IMPORTED_IMPLIB")},
        {'I', QLatin1String("IMPORTED_LINK_DEPENDENT_LIBRARIES")},
        {'I', QLatin1String("IMPORTED_LINK_INTERFACE_LANGUAGES")},
        {'I', QLatin1String("IMPORTED_LINK_INTERFACE_LIBRARIES")},
        {'I', QLatin1String("IMPORTED_LINK_INTERFACE_MULTIPLICITY")},
        {'I', QLatin1String("IMPORTED_LOCATION")},
        {'I', QLatin1String("IMPORTED_NO_SONAME")},
        {'I', QLatin1String("IMPORTED")},
        {'I', QLatin1String("IMPORTED_SONAME")},
        {'I', QLatin1String("IMPORT_PREFIX")},
        {'I', QLatin1String("IMPORT_SUFFIX")},
        {'I', QLatin1String("INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INSTALL_NAME_DIR")},
        {'I', QLatin1String("INSTALL_RPATH")},
        {'I', QLatin1String("INSTALL_RPATH_USE_LINK_PATH")},
        {'I', QLatin1String("INTERFACE_AUTOUIC_OPTIONS")},
        {'I', QLatin1String("INTERFACE_COMPILE_DEFINITIONS")},
        {'I', QLatin1String("INTERFACE_COMPILE_OPTIONS")},
        {'I', QLatin1String("INTERFACE_INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INTERFACE_LINK_LIBRARIES")},
        {'I', QLatin1String("INTERFACE_POSITION_INDEPENDENT_CODE")},
        {'I', QLatin1String("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES")},
        {'I', QLatin1String("INTERPROCEDURAL_OPTIMIZATION")},
        {'J', QLatin1String("JOB_POOL_COMPILE")},
        {'J', QLatin1String("JOB_POOL_LINK")},
        {'L', QLatin1String("LABELS")},
        {'L', QLatin1String("LIBRARY_OUTPUT_DIRECTORY")},
        {'L', QLatin1String("LIBRARY_OUTPUT_NAME")},
        {'L', QLatin1String("LINK_DEPENDS_NO_SHARED")},
        {'L', QLatin1String("LINK_DEPENDS")},
        {'L', QLatin1String("LINKER_LANGUAGE")},
        {'L', QLatin1String("LINK_FLAGS")},
        {'L', QLatin1String("LINK_INTERFACE_LIBRARIES")},
        {'L', QLatin1String("LINK_INTERFACE_MULTIPLICITY")},
        {'L', QLatin1String("LINK_LIBRARIES")},
        {'L', QLatin1String("LINK_SEARCH_END_STATIC")},
        {'L', QLatin1String("LINK_SEARCH_START_STATIC")},
        {'L', QLatin1String("LOCATION")},
        {'M', QLatin1String("MACOSX_BUNDLE_INFO_PLIST")},
        {'M', QLatin1String("MACOSX_BUNDLE")},
        {'M', QLatin1String("MACOSX_FRAMEWORK_INFO_PLIST")},
        {'M', QLatin1String("MACOSX_RPATH")},
        //        {'N', QLatin1String("NAME")},
        {'N', QLatin1String("NO_SONAME")},
        {'N', QLatin1String("NO_SYSTEM_FROM_IMPORTED")},
        {'O', QLatin1String("OSX_ARCHITECTURES")},
        {'O', QLatin1String("OUTPUT_NAME")},
        {'P', QLatin1String("PDB_NAME")},
        {'P', QLatin1String("PDB_OUTPUT_DIRECTORY")},
        {'P', QLatin1String("POSITION_INDEPENDENT_CODE")},
        {'P', QLatin1String("POST_INSTALL_SCRIPT")},
        {'P', QLatin1String("PREFIX")},
        {'P', QLatin1String("PROPERTY")},
        {'P', QLatin1String("PRE_INSTALL_SCRIPT")},
        {'P', QLatin1String("PRIVATE_HEADER")},
        {'P', QLatin1String("PROJECT_LABEL")},
        {'P', QLatin1String("PUBLIC_HEADER")},
        {'R', QLatin1String("RESOURCE")},
        {'R', QLatin1String("RULE_LAUNCH_COMPILE")},
        {'R', QLatin1String("RULE_LAUNCH_CUSTOM")},
        {'R', QLatin1String("RULE_LAUNCH_LINK")},
        {'R', QLatin1String("RUNTIME_OUTPUT_DIRECTORY")},
        {'R', QLatin1String("RUNTIME_OUTPUT_NAME")},
        {'S', QLatin1String("SKIP_BUILD_RPATH")},
        {'S', QLatin1String("SOURCES")},
        {'S', QLatin1String("SOVERSION")},
        {'S', QLatin1String("STATIC_LIBRARY_FLAGS")},
        {'S', QLatin1String("SUFFIX")},
        {'T', QLatin1String("TARGET")},
        {'T', QLatin1String("TYPE")},
        {'V', QLatin1String("VERSION")},
        {'V', QLatin1String("VISIBILITY_INLINES_HIDDEN")},
        {'V', QLatin1String("VS_DOTNET_REFERENCES")},
        {'V', QLatin1String("VS_DOTNET_TARGET_FRAMEWORK_VERSION")},
        {'V', QLatin1String("VS_GLOBAL_KEYWORD")},
        {'V', QLatin1String("VS_GLOBAL_PROJECT_TYPES")},
        {'V', QLatin1String("VS_GLOBAL_ROOTNAMESPACE")},
        {'V', QLatin1String("VS_KEYWORD")},
        {'V', QLatin1String("VS_SCC_AUXPATH")},
        {'V', QLatin1String("VS_SCC_LOCALPATH")},
        {'V', QLatin1String("VS_SCC_PROJECTNAME")},
        {'V', QLatin1String("VS_SCC_PROVIDER")},
        {'V', QLatin1String("VS_WINRT_EXTENSIONS")},
        {'V', QLatin1String("VS_WINRT_REFERENCES")},
        {'W', QLatin1String("WIN32_EXECUTABLE")},
        {'A', QLatin1String("ATTACHED_FILES_ON_FAIL")},
        {'A', QLatin1String("ATTACHED_FILES")},
        {'C', QLatin1String("COST")},
        {'D', QLatin1String("DEPENDS")},
        {'E', QLatin1String("ENVIRONMENT")},
        {'F', QLatin1String("FAIL_REGULAR_EXPRESSION")},
        {'L', QLatin1String("LABELS")},
        {'M', QLatin1String("MEASUREMENT")},
        {'P', QLatin1String("PASS_REGULAR_EXPRESSION")},
        {'P', QLatin1String("PROCESSORS")},
        {'R', QLatin1String("REQUIRED_FILES")},
        {'R', QLatin1String("RESOURCE_LOCK")},
        {'R', QLatin1String("RUN_SERIAL")},
        {'S', QLatin1String("SKIP_RETURN_CODE")},
        {'T', QLatin1String("TIMEOUT")},
        {'W', QLatin1String("WILL_FAIL")},
        {'W', QLatin1String("WORKING_DIRECTORY")},
        {'A', QLatin1String("ABSTRACT")},
        {'A', QLatin1String("AUTOUIC_OPTIONS")},
        {'A', QLatin1String("AUTORCC_OPTIONS")},
        {'C', QLatin1String("COMPILE_DEFINITIONS")},
        {'C', QLatin1String("COMPILE_FLAGS")},
        {'E', QLatin1String("EXTERNAL_OBJECT")},
        {'F', QLatin1String("Fortran_FORMAT")},
        {'G', QLatin1String("GENERATED")},
        {'H', QLatin1String("HEADER_FILE_ONLY")},
        {'K', QLatin1String("KEEP_EXTENSION")},
        {'L', QLatin1String("LABELS")},
        //        {'L', QLatin1String("LANGUAGE")},
        {'L', QLatin1String("LOCATION")},
        {'M', QLatin1String("MACOSX_PACKAGE_LOCATION")},
        {'O', QLatin1String("OBJECT_DEPENDS")},
        {'O', QLatin1String("OBJECT_OUTPUTS")},
        {'S', QLatin1String("SYMBOLIC")},
        {'W', QLatin1String("WRAP_EXCLUDE")},
        {'A', QLatin1String("ADVANCED")},
        {'H', QLatin1String("HELPSTRING")},
        {'M', QLatin1String("MODIFIED")},
        {'S', QLatin1String("STRINGS")},
        {'T', QLatin1String("TYPE")},
        {'V', QLatin1String("VALUE")}};
    cmake_other = {
        {'C', QLatin1String("CMAKE_ARGC")},
        {'C', QLatin1String("CMAKE_ARGV0")},
        {'C', QLatin1String("CMAKE_AR")},
        {'C', QLatin1String("CMAKE_BINARY_DIR")},
        {'C', QLatin1String("CMAKE_BUILD_TOOL")},
        {'C', QLatin1String("CMAKE_CACHEFILE_DIR")},
        {'C', QLatin1String("CMAKE_CACHE_MAJOR_VERSION")},
        {'C', QLatin1String("CMAKE_CACHE_MINOR_VERSION")},
        {'C', QLatin1String("CMAKE_CACHE_PATCH_VERSION")},
        {'C', QLatin1String("CMAKE_CFG_INTDIR")},
        {'C', QLatin1String("CMAKE_COMMAND")},
        {'C', QLatin1String("CMAKE_CROSSCOMPILING")},
        {'C', QLatin1String("CMAKE_CTEST_COMMAND")},
        {'C', QLatin1String("CMAKE_CURRENT_BINARY_DIR")},
        {'C', QLatin1String("CMAKE_CURRENT_LIST_DIR")},
        {'C', QLatin1String("CMAKE_CURRENT_LIST_FILE")},
        {'C', QLatin1String("CMAKE_CURRENT_LIST_LINE")},
        {'C', QLatin1String("CMAKE_CURRENT_SOURCE_DIR")},
        {'C', QLatin1String("CMAKE_DL_LIBS")},
        {'C', QLatin1String("CMAKE_EDIT_COMMAND")},
        {'C', QLatin1String("CMAKE_EXECUTABLE_SUFFIX")},
        {'C', QLatin1String("CMAKE_EXTRA_GENERATOR")},
        {'C', QLatin1String("CMAKE_EXTRA_SHARED_LIBRARY_SUFFIXES")},
        {'C', QLatin1String("CMAKE_GENERATOR")},
        {'C', QLatin1String("CMAKE_GENERATOR_TOOLSET")},
        {'C', QLatin1String("CMAKE_HOME_DIRECTORY")},
        {'C', QLatin1String("CMAKE_IMPORT_LIBRARY_PREFIX")},
        {'C', QLatin1String("CMAKE_IMPORT_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_JOB_POOL_COMPILE")},
        {'C', QLatin1String("CMAKE_JOB_POOL_LINK")},
        {'C', QLatin1String("CMAKE_LINK_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_MAJOR_VERSION")},
        {'C', QLatin1String("CMAKE_MAKE_PROGRAM")},
        {'C', QLatin1String("CMAKE_MINIMUM_REQUIRED_VERSION")},
        {'C', QLatin1String("CMAKE_MINOR_VERSION")},
        {'C', QLatin1String("CMAKE_PARENT_LIST_FILE")},
        {'C', QLatin1String("CMAKE_PATCH_VERSION")},
        {'C', QLatin1String("CMAKE_PROJECT_NAME")},
        {'C', QLatin1String("CMAKE_RANLIB")},
        {'C', QLatin1String("CMAKE_ROOT")},
        {'C', QLatin1String("CMAKE_SCRIPT_MODE_FILE")},
        {'C', QLatin1String("CMAKE_SHARED_LIBRARY_PREFIX")},
        {'C', QLatin1String("CMAKE_SHARED_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_SHARED_MODULE_PREFIX")},
        {'C', QLatin1String("CMAKE_SHARED_MODULE_SUFFIX")},
        {'C', QLatin1String("CMAKE_SIZEOF_VOID_P")},
        {'C', QLatin1String("CMAKE_SKIP_INSTALL_RULES")},
        {'C', QLatin1String("CMAKE_SKIP_RPATH")},
        {'C', QLatin1String("CMAKE_SOURCE_DIR")},
        {'C', QLatin1String("CMAKE_STANDARD_LIBRARIES")},
        {'C', QLatin1String("CMAKE_STATIC_LIBRARY_PREFIX")},
        {'C', QLatin1String("CMAKE_STATIC_LIBRARY_SUFFIX")},
        {'C', QLatin1String("CMAKE_TOOLCHAIN_FILE")},
        {'C', QLatin1String("CMAKE_TWEAK_VERSION")},
        {'C', QLatin1String("CMAKE_VERBOSE_MAKEFILE")},
        {'C', QLatin1String("CMAKE_VERSION")},
        {'C', QLatin1String("CMAKE_VS_DEVENV_COMMAND")},
        {'C', QLatin1String("CMAKE_VS_INTEL_Fortran_PROJECT_VERSION")},
        {'C', QLatin1String("CMAKE_VS_MSBUILD_COMMAND")},
        {'C', QLatin1String("CMAKE_VS_MSDEV_COMMAND")},
        {'C', QLatin1String("CMAKE_VS_PLATFORM_TOOLSET")},
        {'C', QLatin1String("CMAKE_XCODE_PLATFORM_TOOLSET")},
        {'P', QLatin1String("PROJECT_BINARY_DIR")},
        //        {'P', QLatin1String("PROJECT_NAME")},
        {'P', QLatin1String("PROJECT_SOURCE_DIR")},
        {'P', QLatin1String("PROJECT_VERSION")},
        {'P', QLatin1String("PROJECT_VERSION_MAJOR")},
        {'P', QLatin1String("PROJECT_VERSION_MINOR")},
        {'P', QLatin1String("PROJECT_VERSION_PATCH")},
        {'P', QLatin1String("PROJECT_VERSION_TWEAK")},
        {'B', QLatin1String("BUILD_SHARED_LIBS")},
        {'C', QLatin1String("CMAKE_ABSOLUTE_DESTINATION_FILES")},
        {'C', QLatin1String("CMAKE_APPBUNDLE_PATH")},
        {'C', QLatin1String("CMAKE_AUTOMOC_RELAXED_MODE")},
        {'C', QLatin1String("CMAKE_BACKWARDS_COMPATIBILITY")},
        {'C', QLatin1String("CMAKE_BUILD_TYPE")},
        {'C', QLatin1String("CMAKE_COLOR_MAKEFILE")},
        {'C', QLatin1String("CMAKE_CONFIGURATION_TYPES")},
        {'C', QLatin1String("CMAKE_DEBUG_TARGET_PROPERTIES")},
        {'C', QLatin1String("CMAKE_ERROR_DEPRECATED")},
        {'C', QLatin1String("CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION")},
        {'C', QLatin1String("CMAKE_SYSROOT")},
        {'C', QLatin1String("CMAKE_FIND_LIBRARY_PREFIXES")},
        {'C', QLatin1String("CMAKE_FIND_LIBRARY_SUFFIXES")},
        {'C', QLatin1String("CMAKE_FIND_NO_INSTALL_PREFIX")},
        {'C', QLatin1String("CMAKE_FIND_PACKAGE_WARN_NO_MODULE")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_INCLUDE")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_LIBRARY")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_PACKAGE")},
        {'C', QLatin1String("CMAKE_FIND_ROOT_PATH_MODE_PROGRAM")},
        {'C', QLatin1String("CMAKE_FRAMEWORK_PATH")},
        {'C', QLatin1String("CMAKE_IGNORE_PATH")},
        {'C', QLatin1String("CMAKE_INCLUDE_PATH")},
        {'C', QLatin1String("CMAKE_INCLUDE_DIRECTORIES_BEFORE")},
        {'C', QLatin1String("CMAKE_INCLUDE_DIRECTORIES_PROJECT_BEFORE")},
        {'C', QLatin1String("CMAKE_INSTALL_DEFAULT_COMPONENT_NAME")},
        {'C', QLatin1String("CMAKE_INSTALL_PREFIX")},
        {'C', QLatin1String("CMAKE_LIBRARY_PATH")},
        {'C', QLatin1String("CMAKE_MFC_FLAG")},
        {'C', QLatin1String("CMAKE_MODULE_PATH")},
        {'C', QLatin1String("CMAKE_NOT_USING_CONFIG_FLAGS")},
        {'C', QLatin1String("CMAKE_PREFIX_PATH")},
        {'C', QLatin1String("CMAKE_PROGRAM_PATH")},
        {'C', QLatin1String("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY")},
        {'C', QLatin1String("CMAKE_STAGING_PREFIX")},
        {'C', QLatin1String("CMAKE_SYSTEM_IGNORE_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_INCLUDE_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_LIBRARY_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_PREFIX_PATH")},
        {'C', QLatin1String("CMAKE_SYSTEM_PROGRAM_PATH")},
        {'C', QLatin1String("CMAKE_USER_MAKE_RULES_OVERRIDE")},
        {'C', QLatin1String("CMAKE_WARN_DEPRECATED")},
        {'C', QLatin1String("CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION")},
        {'A', QLatin1String("APPLE")},
        {'B', QLatin1String("BORLAND")},
        {'C', QLatin1String("CMAKE_CL_64")},
        {'C', QLatin1String("CMAKE_COMPILER_2005")},
        {'C', QLatin1String("CMAKE_HOST_APPLE")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM_NAME")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM_PROCESSOR")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM")},
        {'C', QLatin1String("CMAKE_HOST_SYSTEM_VERSION")},
        {'C', QLatin1String("CMAKE_HOST_UNIX")},
        {'C', QLatin1String("CMAKE_HOST_WIN32")},
        {'C', QLatin1String("CMAKE_LIBRARY_ARCHITECTURE_REGEX")},
        {'C', QLatin1String("CMAKE_LIBRARY_ARCHITECTURE")},
        {'C', QLatin1String("CMAKE_OBJECT_PATH_MAX")},
        {'C', QLatin1String("CMAKE_SYSTEM_NAME")},
        {'C', QLatin1String("CMAKE_SYSTEM_PROCESSOR")},
        {'C', QLatin1String("CMAKE_SYSTEM")},
        {'C', QLatin1String("CMAKE_SYSTEM_VERSION")},
        {'C', QLatin1String("CYGWIN")},
        {'E', QLatin1String("ENV")},
        {'M', QLatin1String("MSVC10")},
        {'M', QLatin1String("MSVC11")},
        {'M', QLatin1String("MSVC12")},
        {'M', QLatin1String("MSVC60")},
        {'M', QLatin1String("MSVC70")},
        {'M', QLatin1String("MSVC71")},
        {'M', QLatin1String("MSVC80")},
        {'M', QLatin1String("MSVC90")},
        {'M', QLatin1String("MSVC_IDE")},
        {'M', QLatin1String("MSVC")},
        {'M', QLatin1String("MSVC_VERSION")},
        {'U', QLatin1String("UNIX")},
        {'W', QLatin1String("WIN32")},
        {'X', QLatin1String("XCODE_VERSION")},
        {'C', QLatin1String("CMAKE_ARCHIVE_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_AUTOMOC_MOC_OPTIONS")},
        {'C', QLatin1String("CMAKE_AUTOMOC")},
        {'C', QLatin1String("CMAKE_AUTORCC")},
        {'C', QLatin1String("CMAKE_AUTORCC_OPTIONS")},
        {'C', QLatin1String("CMAKE_AUTOUIC")},
        {'C', QLatin1String("CMAKE_AUTOUIC_OPTIONS")},
        {'C', QLatin1String("CMAKE_BUILD_WITH_INSTALL_RPATH")},
        {'C', QLatin1String("CMAKE_DEBUG_POSTFIX")},
        {'C', QLatin1String("CMAKE_EXE_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_Fortran_FORMAT")},
        {'C', QLatin1String("CMAKE_Fortran_MODULE_DIRECTORY")},
        {'C', QLatin1String("CMAKE_GNUtoMS")},
        {'C', QLatin1String("CMAKE_INCLUDE_CURRENT_DIR_IN_INTERFACE")},
        {'C', QLatin1String("CMAKE_INCLUDE_CURRENT_DIR")},
        {'C', QLatin1String("CMAKE_INSTALL_NAME_DIR")},
        {'C', QLatin1String("CMAKE_INSTALL_RPATH")},
        {'C', QLatin1String("CMAKE_INSTALL_RPATH_USE_LINK_PATH")},
        {'C', QLatin1String("CMAKE_LIBRARY_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_LIBRARY_PATH_FLAG")},
        {'C', QLatin1String("CMAKE_LINK_DEF_FILE_FLAG")},
        {'C', QLatin1String("CMAKE_LINK_DEPENDS_NO_SHARED")},
        {'C', QLatin1String("CMAKE_LINK_INTERFACE_LIBRARIES")},
        {'C', QLatin1String("CMAKE_LINK_LIBRARY_FILE_FLAG")},
        {'C', QLatin1String("CMAKE_LINK_LIBRARY_FLAG")},
        {'C', QLatin1String("CMAKE_MACOSX_BUNDLE")},
        {'C', QLatin1String("CMAKE_MACOSX_RPATH")},
        {'C', QLatin1String("CMAKE_MODULE_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_NO_BUILTIN_CHRPATH")},
        {'C', QLatin1String("CMAKE_NO_SYSTEM_FROM_IMPORTED")},
        {'C', QLatin1String("CMAKE_OSX_ARCHITECTURES")},
        {'C', QLatin1String("CMAKE_OSX_DEPLOYMENT_TARGET")},
        {'C', QLatin1String("CMAKE_OSX_SYSROOT")},
        {'C', QLatin1String("CMAKE_PDB_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_POSITION_INDEPENDENT_CODE")},
        {'C', QLatin1String("CMAKE_RUNTIME_OUTPUT_DIRECTORY")},
        {'C', QLatin1String("CMAKE_SHARED_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_SKIP_BUILD_RPATH")},
        {'C', QLatin1String("CMAKE_SKIP_INSTALL_RPATH")},
        {'C', QLatin1String("CMAKE_STATIC_LINKER_FLAGS")},
        {'C', QLatin1String("CMAKE_TRY_COMPILE_CONFIGURATION")},
        {'C', QLatin1String("CMAKE_USE_RELATIVE_PATHS")},
        {'C', QLatin1String("CMAKE_VISIBILITY_INLINES_HIDDEN")},
        {'C', QLatin1String("CMAKE_WIN32_EXECUTABLE")},
        {'E', QLatin1String("EXECUTABLE_OUTPUT_PATH")},
        {'L', QLatin1String("LIBRARY_OUTPUT_PATH")},
        {'C', QLatin1String("CMAKE_Fortran_MODDIR_DEFAULT")},
        {'C', QLatin1String("CMAKE_Fortran_MODDIR_FLAG")},
        {'C', QLatin1String("CMAKE_Fortran_MODOUT_FLAG")},
        {'C', QLatin1String("CMAKE_INTERNAL_PLATFORM_ABI")},
        {'C', QLatin1String("CPACK_ABSOLUTE_DESTINATION_FILES")},
        {'C', QLatin1String("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")},
        {'C', QLatin1String("CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION")},
        {'C', QLatin1String("CPACK_INCLUDE_TOPLEVEL_DIRECTORY")},
        {'C', QLatin1String("CPACK_INSTALL_SCRIPT")},
        {'C', QLatin1String("CPACK_PACKAGING_INSTALL_PREFIX")},
        {'C', QLatin1String("CPACK_SET_DESTDIR")},
        {'C', QLatin1String("CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION")}};
}